

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  code *pcVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  uint uVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined8 uVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [28];
  int iVar98;
  uint uVar99;
  uint uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  long lVar104;
  long lVar105;
  undefined4 uVar106;
  undefined8 unaff_R14;
  ulong uVar107;
  undefined8 uVar108;
  float fVar130;
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  float fVar128;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar113 [32];
  undefined1 auVar110 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar129;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar111 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar153;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined8 uVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar206;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 in_ZMM9 [64];
  undefined1 auVar210 [64];
  undefined1 auVar217 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 in_ZMM10 [64];
  undefined1 auVar218 [64];
  undefined4 uVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar234 [64];
  undefined1 auVar233 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined4 local_980;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 (*local_7a8) [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [2] [32];
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [16];
  uint uStack_5b0;
  uint uStack_5ac;
  uint uStack_5a8;
  uint uStack_5a4;
  undefined1 local_5a0 [16];
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  int local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar101 = (ulong)(byte)PVar12;
  auVar174 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar174 = vinsertps_avx(auVar174,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar153 = *(float *)(prim + uVar101 * 0x19 + 0x12);
  auVar174 = vsubps_avx(auVar174,*(undefined1 (*) [16])(prim + uVar101 * 0x19 + 6));
  auVar109._0_4_ = fVar153 * auVar174._0_4_;
  auVar109._4_4_ = fVar153 * auVar174._4_4_;
  auVar109._8_4_ = fVar153 * auVar174._8_4_;
  auVar109._12_4_ = fVar153 * auVar174._12_4_;
  auVar184._0_4_ = fVar153 * auVar18._0_4_;
  auVar184._4_4_ = fVar153 * auVar18._4_4_;
  auVar184._8_4_ = fVar153 * auVar18._8_4_;
  auVar184._12_4_ = fVar153 * auVar18._12_4_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar101 * 4 + 6);
  auVar113 = vpmovsxbd_avx2(auVar174);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar101 * 5 + 6);
  auVar125 = vpmovsxbd_avx2(auVar18);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar101 * 6 + 6);
  auVar121 = vpmovsxbd_avx2(auVar6);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar101 * 0xb + 6);
  auVar141 = vpmovsxbd_avx2(auVar7);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar101 * 0xc + 6);
  auVar124 = vpmovsxbd_avx2(auVar8);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar101 * 0xd + 6);
  auVar209 = vpmovsxbd_avx2(auVar179);
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar101 * 0x12 + 6);
  auVar201 = vpmovsxbd_avx2(auVar9);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar101 * 0x13 + 6);
  auVar123 = vpmovsxbd_avx2(auVar10);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar101 * 0x14 + 6);
  auVar23 = vpmovsxbd_avx2(auVar11);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar230._4_4_ = auVar184._0_4_;
  auVar230._0_4_ = auVar184._0_4_;
  auVar230._8_4_ = auVar184._0_4_;
  auVar230._12_4_ = auVar184._0_4_;
  auVar230._16_4_ = auVar184._0_4_;
  auVar230._20_4_ = auVar184._0_4_;
  auVar230._24_4_ = auVar184._0_4_;
  auVar230._28_4_ = auVar184._0_4_;
  auVar174 = vmovshdup_avx(auVar184);
  uVar183 = auVar174._0_8_;
  auVar236._8_8_ = uVar183;
  auVar236._0_8_ = uVar183;
  auVar236._16_8_ = uVar183;
  auVar236._24_8_ = uVar183;
  auVar174 = vshufps_avx(auVar184,auVar184,0xaa);
  fVar153 = auVar174._0_4_;
  auVar234._0_4_ = fVar153 * auVar121._0_4_;
  fVar128 = auVar174._4_4_;
  auVar234._4_4_ = fVar128 * auVar121._4_4_;
  auVar234._8_4_ = fVar153 * auVar121._8_4_;
  auVar234._12_4_ = fVar128 * auVar121._12_4_;
  auVar234._16_4_ = fVar153 * auVar121._16_4_;
  auVar234._20_4_ = fVar128 * auVar121._20_4_;
  auVar234._28_36_ = in_ZMM10._28_36_;
  auVar234._24_4_ = fVar153 * auVar121._24_4_;
  auVar228._0_4_ = auVar209._0_4_ * fVar153;
  auVar228._4_4_ = auVar209._4_4_ * fVar128;
  auVar228._8_4_ = auVar209._8_4_ * fVar153;
  auVar228._12_4_ = auVar209._12_4_ * fVar128;
  auVar228._16_4_ = auVar209._16_4_ * fVar153;
  auVar228._20_4_ = auVar209._20_4_ * fVar128;
  auVar228._28_36_ = in_ZMM9._28_36_;
  auVar228._24_4_ = auVar209._24_4_ * fVar153;
  auVar197._0_4_ = auVar23._0_4_ * fVar153;
  auVar197._4_4_ = auVar23._4_4_ * fVar128;
  auVar197._8_4_ = auVar23._8_4_ * fVar153;
  auVar197._12_4_ = auVar23._12_4_ * fVar128;
  auVar197._16_4_ = auVar23._16_4_ * fVar153;
  auVar197._20_4_ = auVar23._20_4_ * fVar128;
  auVar197._24_4_ = auVar23._24_4_ * fVar153;
  auVar197._28_4_ = 0;
  auVar174 = vfmadd231ps_fma(auVar234._0_32_,auVar236,auVar125);
  auVar18 = vfmadd231ps_fma(auVar228._0_32_,auVar236,auVar124);
  auVar6 = vfmadd231ps_fma(auVar197,auVar123,auVar236);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar230,auVar113);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar230,auVar141);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar201,auVar230);
  auVar231._4_4_ = auVar109._0_4_;
  auVar231._0_4_ = auVar109._0_4_;
  auVar231._8_4_ = auVar109._0_4_;
  auVar231._12_4_ = auVar109._0_4_;
  auVar231._16_4_ = auVar109._0_4_;
  auVar231._20_4_ = auVar109._0_4_;
  auVar231._24_4_ = auVar109._0_4_;
  auVar231._28_4_ = auVar109._0_4_;
  auVar174 = vmovshdup_avx(auVar109);
  uVar183 = auVar174._0_8_;
  auVar237._8_8_ = uVar183;
  auVar237._0_8_ = uVar183;
  auVar237._16_8_ = uVar183;
  auVar237._24_8_ = uVar183;
  auVar174 = vshufps_avx(auVar109,auVar109,0xaa);
  fVar153 = auVar174._0_4_;
  auVar185._0_4_ = fVar153 * auVar121._0_4_;
  fVar128 = auVar174._4_4_;
  auVar185._4_4_ = fVar128 * auVar121._4_4_;
  auVar185._8_4_ = fVar153 * auVar121._8_4_;
  auVar185._12_4_ = fVar128 * auVar121._12_4_;
  auVar185._16_4_ = fVar153 * auVar121._16_4_;
  auVar185._20_4_ = fVar128 * auVar121._20_4_;
  auVar185._24_4_ = fVar153 * auVar121._24_4_;
  auVar185._28_4_ = 0;
  auVar144._4_4_ = auVar209._4_4_ * fVar128;
  auVar144._0_4_ = auVar209._0_4_ * fVar153;
  auVar144._8_4_ = auVar209._8_4_ * fVar153;
  auVar144._12_4_ = auVar209._12_4_ * fVar128;
  auVar144._16_4_ = auVar209._16_4_ * fVar153;
  auVar144._20_4_ = auVar209._20_4_ * fVar128;
  auVar144._24_4_ = auVar209._24_4_ * fVar153;
  auVar144._28_4_ = auVar121._28_4_;
  auVar121._4_4_ = auVar23._4_4_ * fVar128;
  auVar121._0_4_ = auVar23._0_4_ * fVar153;
  auVar121._8_4_ = auVar23._8_4_ * fVar153;
  auVar121._12_4_ = auVar23._12_4_ * fVar128;
  auVar121._16_4_ = auVar23._16_4_ * fVar153;
  auVar121._20_4_ = auVar23._20_4_ * fVar128;
  auVar121._24_4_ = auVar23._24_4_ * fVar153;
  auVar121._28_4_ = fVar128;
  auVar174 = vfmadd231ps_fma(auVar185,auVar237,auVar125);
  auVar8 = vfmadd231ps_fma(auVar144,auVar237,auVar124);
  auVar179 = vfmadd231ps_fma(auVar121,auVar237,auVar123);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar231,auVar113);
  local_280._8_4_ = 0x7fffffff;
  local_280._0_8_ = 0x7fffffff7fffffff;
  local_280._12_4_ = 0x7fffffff;
  local_280._16_4_ = 0x7fffffff;
  local_280._20_4_ = 0x7fffffff;
  local_280._24_4_ = 0x7fffffff;
  local_280._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar231,auVar141);
  auVar113 = vandps_avx(ZEXT1632(auVar7),local_280);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  auVar113 = vcmpps_avx(auVar113,auVar198,1);
  auVar125 = vblendvps_avx(ZEXT1632(auVar7),auVar198,auVar113);
  auVar113 = vandps_avx(ZEXT1632(auVar18),local_280);
  auVar113 = vcmpps_avx(auVar113,auVar198,1);
  auVar121 = vblendvps_avx(ZEXT1632(auVar18),auVar198,auVar113);
  auVar113 = vandps_avx(local_280,ZEXT1632(auVar6));
  auVar113 = vcmpps_avx(auVar113,auVar198,1);
  auVar141 = vrcpps_avx(auVar125);
  auVar113 = vblendvps_avx(ZEXT1632(auVar6),auVar198,auVar113);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar192._16_4_ = 0x3f800000;
  auVar192._20_4_ = 0x3f800000;
  auVar192._24_4_ = 0x3f800000;
  auVar192._28_4_ = 0x3f800000;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar231,auVar201);
  auVar124 = vrcpps_avx(auVar121);
  auVar174 = vfnmadd213ps_fma(auVar125,auVar141,auVar192);
  auVar174 = vfmadd132ps_fma(ZEXT1632(auVar174),auVar141,auVar141);
  auVar18 = vfnmadd213ps_fma(auVar121,auVar124,auVar192);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar124,auVar124);
  auVar125 = vrcpps_avx(auVar113);
  auVar6 = vfnmadd213ps_fma(auVar113,auVar125,auVar192);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar125,auVar125);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 7 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar9));
  auVar141._4_4_ = auVar174._4_4_ * auVar113._4_4_;
  auVar141._0_4_ = auVar174._0_4_ * auVar113._0_4_;
  auVar141._8_4_ = auVar174._8_4_ * auVar113._8_4_;
  auVar141._12_4_ = auVar174._12_4_ * auVar113._12_4_;
  auVar141._16_4_ = auVar113._16_4_ * 0.0;
  auVar141._20_4_ = auVar113._20_4_ * 0.0;
  auVar141._24_4_ = auVar113._24_4_ * 0.0;
  auVar141._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 9 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar9));
  auVar124._4_4_ = auVar174._4_4_ * auVar113._4_4_;
  auVar124._0_4_ = auVar174._0_4_ * auVar113._0_4_;
  auVar124._8_4_ = auVar174._8_4_ * auVar113._8_4_;
  auVar124._12_4_ = auVar174._12_4_ * auVar113._12_4_;
  auVar124._16_4_ = auVar113._16_4_ * 0.0;
  auVar124._20_4_ = auVar113._20_4_ * 0.0;
  auVar124._24_4_ = auVar113._24_4_ * 0.0;
  auVar124._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 0xe + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar8));
  auVar209._4_4_ = auVar18._4_4_ * auVar113._4_4_;
  auVar209._0_4_ = auVar18._0_4_ * auVar113._0_4_;
  auVar209._8_4_ = auVar18._8_4_ * auVar113._8_4_;
  auVar209._12_4_ = auVar18._12_4_ * auVar113._12_4_;
  auVar209._16_4_ = auVar113._16_4_ * 0.0;
  auVar209._20_4_ = auVar113._20_4_ * 0.0;
  auVar209._24_4_ = auVar113._24_4_ * 0.0;
  auVar209._28_4_ = auVar113._28_4_;
  auVar135._1_3_ = 0;
  auVar135[0] = PVar12;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar8));
  auVar201._4_4_ = auVar18._4_4_ * auVar113._4_4_;
  auVar201._0_4_ = auVar18._0_4_ * auVar113._0_4_;
  auVar201._8_4_ = auVar18._8_4_ * auVar113._8_4_;
  auVar201._12_4_ = auVar18._12_4_ * auVar113._12_4_;
  auVar201._16_4_ = auVar113._16_4_ * 0.0;
  auVar201._20_4_ = auVar113._20_4_ * 0.0;
  auVar201._24_4_ = auVar113._24_4_ * 0.0;
  auVar201._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 0x15 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar7));
  auVar123._4_4_ = auVar113._4_4_ * auVar6._4_4_;
  auVar123._0_4_ = auVar113._0_4_ * auVar6._0_4_;
  auVar123._8_4_ = auVar113._8_4_ * auVar6._8_4_;
  auVar123._12_4_ = auVar113._12_4_ * auVar6._12_4_;
  auVar123._16_4_ = auVar113._16_4_ * 0.0;
  auVar123._20_4_ = auVar113._20_4_ * 0.0;
  auVar123._24_4_ = auVar113._24_4_ * 0.0;
  auVar123._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 * 0x17 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar7));
  auVar23._4_4_ = auVar6._4_4_ * auVar113._4_4_;
  auVar23._0_4_ = auVar6._0_4_ * auVar113._0_4_;
  auVar23._8_4_ = auVar6._8_4_ * auVar113._8_4_;
  auVar23._12_4_ = auVar6._12_4_ * auVar113._12_4_;
  auVar23._16_4_ = auVar113._16_4_ * 0.0;
  auVar23._20_4_ = auVar113._20_4_ * 0.0;
  auVar23._24_4_ = auVar113._24_4_ * 0.0;
  auVar23._28_4_ = auVar113._28_4_;
  auVar113 = vpminsd_avx2(auVar141,auVar124);
  auVar125 = vpminsd_avx2(auVar209,auVar201);
  auVar113 = vmaxps_avx(auVar113,auVar125);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar199._4_4_ = uVar106;
  auVar199._0_4_ = uVar106;
  auVar199._8_4_ = uVar106;
  auVar199._12_4_ = uVar106;
  auVar199._16_4_ = uVar106;
  auVar199._20_4_ = uVar106;
  auVar199._24_4_ = uVar106;
  auVar199._28_4_ = uVar106;
  auVar125 = vpminsd_avx2(auVar123,auVar23);
  auVar125 = vmaxps_avx(auVar125,auVar199);
  auVar113 = vmaxps_avx(auVar113,auVar125);
  local_80._4_4_ = auVar113._4_4_ * 0.99999964;
  local_80._0_4_ = auVar113._0_4_ * 0.99999964;
  local_80._8_4_ = auVar113._8_4_ * 0.99999964;
  local_80._12_4_ = auVar113._12_4_ * 0.99999964;
  local_80._16_4_ = auVar113._16_4_ * 0.99999964;
  local_80._20_4_ = auVar113._20_4_ * 0.99999964;
  local_80._24_4_ = auVar113._24_4_ * 0.99999964;
  local_80._28_4_ = auVar125._28_4_;
  auVar113 = vpmaxsd_avx2(auVar141,auVar124);
  auVar125 = vpmaxsd_avx2(auVar209,auVar201);
  auVar113 = vminps_avx(auVar113,auVar125);
  auVar125 = vpmaxsd_avx2(auVar123,auVar23);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar162._4_4_ = uVar106;
  auVar162._0_4_ = uVar106;
  auVar162._8_4_ = uVar106;
  auVar162._12_4_ = uVar106;
  auVar162._16_4_ = uVar106;
  auVar162._20_4_ = uVar106;
  auVar162._24_4_ = uVar106;
  auVar162._28_4_ = uVar106;
  auVar125 = vminps_avx(auVar125,auVar162);
  auVar113 = vminps_avx(auVar113,auVar125);
  auVar193._4_4_ = auVar113._4_4_ * 1.0000004;
  auVar193._0_4_ = auVar113._0_4_ * 1.0000004;
  auVar193._8_4_ = auVar113._8_4_ * 1.0000004;
  auVar193._12_4_ = auVar113._12_4_ * 1.0000004;
  auVar193._16_4_ = auVar113._16_4_ * 1.0000004;
  auVar193._20_4_ = auVar113._20_4_ * 1.0000004;
  auVar193._24_4_ = auVar113._24_4_ * 1.0000004;
  auVar193._28_4_ = auVar113._28_4_;
  auVar135[4] = PVar12;
  auVar135._5_3_ = 0;
  auVar135[8] = PVar12;
  auVar135._9_3_ = 0;
  auVar135[0xc] = PVar12;
  auVar135._13_3_ = 0;
  auVar135[0x10] = PVar12;
  auVar135._17_3_ = 0;
  auVar135[0x14] = PVar12;
  auVar135._21_3_ = 0;
  auVar135[0x18] = PVar12;
  auVar135._25_3_ = 0;
  auVar135[0x1c] = PVar12;
  auVar135._29_3_ = 0;
  auVar125 = vpcmpgtd_avx2(auVar135,_DAT_01fb4ba0);
  auVar113 = vcmpps_avx(local_80,auVar193,2);
  auVar113 = vandps_avx(auVar113,auVar125);
  uVar106 = vmovmskps_avx(auVar113);
  uVar107 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar106);
  local_6c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_6c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_6c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_6c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_7a8 = (undefined1 (*) [32])&local_160;
  iVar98 = 1 << ((uint)k & 0x1f);
  auVar113._4_4_ = iVar98;
  auVar113._0_4_ = iVar98;
  auVar113._8_4_ = iVar98;
  auVar113._12_4_ = iVar98;
  auVar113._16_4_ = iVar98;
  auVar113._20_4_ = iVar98;
  auVar113._24_4_ = iVar98;
  auVar113._28_4_ = iVar98;
  auVar125 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar113 = vpand_avx2(auVar113,auVar125);
  local_2a0 = vpcmpeqd_avx2(auVar113,auVar125);
  do {
    auVar113 = local_580;
    if (uVar107 == 0) {
      return;
    }
    lVar104 = 0;
    for (uVar102 = uVar107; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
      lVar104 = lVar104 + 1;
    }
    uVar107 = uVar107 - 1 & uVar107;
    uVar99 = *(uint *)(prim + lVar104 * 4 + 6);
    uVar102 = (ulong)(uint)((int)lVar104 << 6);
    uVar13 = *(uint *)(prim + 2);
    pGVar15 = (context->scene->geometries).items[uVar13].ptr;
    pPVar1 = prim + uVar102 + uVar101 * 0x19 + 0x16;
    uVar183 = *(undefined8 *)pPVar1;
    uVar95 = *(undefined8 *)(pPVar1 + 8);
    auVar6 = *(undefined1 (*) [16])pPVar1;
    auVar18 = *(undefined1 (*) [16])pPVar1;
    auVar174 = *(undefined1 (*) [16])pPVar1;
    if (uVar107 != 0) {
      uVar103 = uVar107 - 1 & uVar107;
      for (uVar25 = uVar107; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
      }
      if (uVar103 != 0) {
        for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar7 = *(undefined1 (*) [16])(prim + uVar102 + uVar101 * 0x19 + 0x26);
    auVar8 = *(undefined1 (*) [16])(prim + uVar102 + uVar101 * 0x19 + 0x36);
    auVar179 = *(undefined1 (*) [16])(prim + uVar102 + uVar101 * 0x19 + 0x46);
    iVar98 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
    auVar109 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar10 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar109);
    uVar106 = auVar10._0_4_;
    auVar167._4_4_ = uVar106;
    auVar167._0_4_ = uVar106;
    auVar167._8_4_ = uVar106;
    auVar167._12_4_ = uVar106;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar153 = pre->ray_space[k].vz.field_0.m128[0];
    fVar128 = pre->ray_space[k].vz.field_0.m128[1];
    fVar19 = pre->ray_space[k].vz.field_0.m128[2];
    fVar129 = pre->ray_space[k].vz.field_0.m128[3];
    auVar190._0_4_ = fVar153 * auVar10._0_4_;
    auVar190._4_4_ = fVar128 * auVar10._4_4_;
    auVar190._8_4_ = fVar19 * auVar10._8_4_;
    auVar190._12_4_ = fVar129 * auVar10._12_4_;
    auVar9 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar9);
    auVar167 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar4,auVar167);
    auVar9 = vblendps_avx(auVar167,*(undefined1 (*) [16])pPVar1,8);
    auVar11 = vsubps_avx(auVar7,auVar109);
    uVar106 = auVar11._0_4_;
    auVar191._4_4_ = uVar106;
    auVar191._0_4_ = uVar106;
    auVar191._8_4_ = uVar106;
    auVar191._12_4_ = uVar106;
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar217._0_4_ = fVar153 * auVar11._0_4_;
    auVar217._4_4_ = fVar128 * auVar11._4_4_;
    auVar217._8_4_ = fVar19 * auVar11._8_4_;
    auVar217._12_4_ = fVar129 * auVar11._12_4_;
    auVar10 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar10);
    auVar190 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar4,auVar191);
    auVar10 = vblendps_avx(auVar190,auVar7,8);
    auVar184 = vsubps_avx(auVar8,auVar109);
    uVar106 = auVar184._0_4_;
    auVar195._4_4_ = uVar106;
    auVar195._0_4_ = uVar106;
    auVar195._8_4_ = uVar106;
    auVar195._12_4_ = uVar106;
    auVar11 = vshufps_avx(auVar184,auVar184,0x55);
    auVar184 = vshufps_avx(auVar184,auVar184,0xaa);
    auVar223._0_4_ = fVar153 * auVar184._0_4_;
    auVar223._4_4_ = fVar128 * auVar184._4_4_;
    auVar223._8_4_ = fVar19 * auVar184._8_4_;
    auVar223._12_4_ = fVar129 * auVar184._12_4_;
    auVar11 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar11);
    auVar191 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar195);
    auVar11 = vblendps_avx(auVar191,auVar8,8);
    auVar184 = vsubps_avx(auVar179,auVar109);
    uVar106 = auVar184._0_4_;
    auVar196._4_4_ = uVar106;
    auVar196._0_4_ = uVar106;
    auVar196._8_4_ = uVar106;
    auVar196._12_4_ = uVar106;
    auVar109 = vshufps_avx(auVar184,auVar184,0x55);
    auVar184 = vshufps_avx(auVar184,auVar184,0xaa);
    auVar225._0_4_ = fVar153 * auVar184._0_4_;
    auVar225._4_4_ = fVar128 * auVar184._4_4_;
    auVar225._8_4_ = fVar19 * auVar184._8_4_;
    auVar225._12_4_ = fVar129 * auVar184._12_4_;
    auVar109 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar109);
    auVar195 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar196);
    auVar110._8_4_ = 0x7fffffff;
    auVar110._0_8_ = 0x7fffffff7fffffff;
    auVar110._12_4_ = 0x7fffffff;
    auVar109 = vblendps_avx(auVar195,auVar179,8);
    auVar9 = vandps_avx(auVar9,auVar110);
    auVar10 = vandps_avx(auVar10,auVar110);
    auVar184 = vmaxps_avx(auVar9,auVar10);
    auVar9 = vandps_avx(auVar11,auVar110);
    auVar10 = vandps_avx(auVar109,auVar110);
    auVar9 = vmaxps_avx(auVar9,auVar10);
    auVar9 = vmaxps_avx(auVar184,auVar9);
    auVar10 = vmovshdup_avx(auVar9);
    auVar10 = vmaxss_avx(auVar10,auVar9);
    auVar9 = vshufpd_avx(auVar9,auVar9,1);
    auVar9 = vmaxss_avx(auVar9,auVar10);
    lVar104 = (long)iVar98 * 0x44;
    auVar10 = vmovshdup_avx(auVar167);
    uVar108 = auVar10._0_8_;
    local_640._8_8_ = uVar108;
    local_640._0_8_ = uVar108;
    local_640._16_8_ = uVar108;
    local_640._24_8_ = uVar108;
    auVar10 = vmovshdup_avx(auVar190);
    uVar108 = auVar10._0_8_;
    local_5e0._8_8_ = uVar108;
    local_5e0._0_8_ = uVar108;
    local_5e0._16_8_ = uVar108;
    local_5e0._24_8_ = uVar108;
    auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar104 + 0x908);
    uVar222 = auVar191._0_4_;
    local_700._4_4_ = uVar222;
    local_700._0_4_ = uVar222;
    local_700._8_4_ = uVar222;
    local_700._12_4_ = uVar222;
    local_700._16_4_ = uVar222;
    local_700._20_4_ = uVar222;
    local_700._24_4_ = uVar222;
    local_700._28_4_ = uVar222;
    auVar10 = vmovshdup_avx(auVar191);
    uVar108 = auVar10._0_8_;
    local_660._8_8_ = uVar108;
    local_660._0_8_ = uVar108;
    local_660._16_8_ = uVar108;
    local_660._24_8_ = uVar108;
    pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar104 + 0xd8c);
    fVar134 = *(float *)*pauVar2;
    fVar203 = *(float *)(bspline_basis0 + lVar104 + 0xd90);
    fVar204 = *(float *)(bspline_basis0 + lVar104 + 0xd94);
    fVar205 = *(float *)(bspline_basis0 + lVar104 + 0xd98);
    fVar219 = *(float *)(bspline_basis0 + lVar104 + 0xd9c);
    fVar220 = *(float *)(bspline_basis0 + lVar104 + 0xda0);
    fVar221 = *(float *)(bspline_basis0 + lVar104 + 0xda4);
    auVar97 = *(undefined1 (*) [28])*pauVar2;
    local_540 = auVar195._0_4_;
    auVar10 = vmovshdup_avx(auVar195);
    local_740 = auVar10._0_8_;
    auVar136._0_4_ = local_540 * fVar134;
    auVar136._4_4_ = local_540 * fVar203;
    auVar136._8_4_ = local_540 * fVar204;
    auVar136._12_4_ = local_540 * fVar205;
    auVar136._16_4_ = local_540 * fVar219;
    auVar136._20_4_ = local_540 * fVar220;
    auVar136._24_4_ = local_540 * fVar221;
    auVar136._28_4_ = 0;
    auVar11 = vfmadd231ps_fma(auVar136,auVar125,local_700);
    fVar153 = auVar10._0_4_;
    auVar232._0_4_ = fVar134 * fVar153;
    fVar129 = auVar10._4_4_;
    auVar232._4_4_ = fVar203 * fVar129;
    auVar232._8_4_ = fVar204 * fVar153;
    auVar232._12_4_ = fVar205 * fVar129;
    auVar232._16_4_ = fVar219 * fVar153;
    auVar232._20_4_ = fVar220 * fVar129;
    auVar232._24_4_ = fVar221 * fVar153;
    auVar232._28_4_ = 0;
    auVar10 = vfmadd231ps_fma(auVar232,auVar125,local_660);
    auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar104 + 0x484);
    uVar106 = auVar190._0_4_;
    auVar186._4_4_ = uVar106;
    auVar186._0_4_ = uVar106;
    auVar186._8_4_ = uVar106;
    auVar186._12_4_ = uVar106;
    auVar186._16_4_ = uVar106;
    auVar186._20_4_ = uVar106;
    auVar186._24_4_ = uVar106;
    auVar186._28_4_ = uVar106;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,auVar186);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar121,local_5e0);
    auVar141 = *(undefined1 (*) [32])(bspline_basis0 + lVar104);
    local_980 = auVar167._0_4_;
    auVar168._4_4_ = local_980;
    auVar168._0_4_ = local_980;
    auVar168._8_4_ = local_980;
    auVar168._12_4_ = local_980;
    auVar168._16_4_ = local_980;
    auVar168._20_4_ = local_980;
    auVar168._24_4_ = local_980;
    auVar168._28_4_ = local_980;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar141,auVar168);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar141,local_640);
    auVar124 = *(undefined1 (*) [32])(bspline_basis1 + lVar104 + 0x908);
    fVar88 = *(float *)(bspline_basis1 + lVar104 + 0xd8c);
    fVar89 = *(float *)(bspline_basis1 + lVar104 + 0xd90);
    fVar90 = *(float *)(bspline_basis1 + lVar104 + 0xd94);
    fVar91 = *(float *)(bspline_basis1 + lVar104 + 0xd98);
    fVar92 = *(float *)(bspline_basis1 + lVar104 + 0xd9c);
    fVar93 = *(float *)(bspline_basis1 + lVar104 + 0xda0);
    fVar94 = *(float *)(bspline_basis1 + lVar104 + 0xda4);
    auVar114._0_4_ = local_540 * fVar88;
    auVar114._4_4_ = local_540 * fVar89;
    auVar114._8_4_ = local_540 * fVar90;
    auVar114._12_4_ = local_540 * fVar91;
    auVar114._16_4_ = local_540 * fVar92;
    auVar114._20_4_ = local_540 * fVar93;
    auVar114._24_4_ = local_540 * fVar94;
    auVar114._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(auVar114,auVar124,local_700);
    auVar26._4_4_ = fVar89 * fVar129;
    auVar26._0_4_ = fVar88 * fVar153;
    auVar26._8_4_ = fVar90 * fVar153;
    auVar26._12_4_ = fVar91 * fVar129;
    auVar26._16_4_ = fVar92 * fVar153;
    auVar26._20_4_ = fVar93 * fVar129;
    auVar26._24_4_ = fVar94 * fVar153;
    auVar26._28_4_ = uVar222;
    auVar184 = vfmadd231ps_fma(auVar26,auVar124,local_660);
    auVar209 = *(undefined1 (*) [32])(bspline_basis1 + lVar104 + 0x484);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar209,auVar186);
    auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar209,local_5e0);
    auVar201 = *(undefined1 (*) [32])(bspline_basis1 + lVar104);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar201,auVar168);
    auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar201,local_640);
    _local_420 = ZEXT1632(auVar109);
    local_400 = ZEXT1632(auVar11);
    local_480 = vsubps_avx(_local_420,local_400);
    local_440 = ZEXT1632(auVar184);
    local_460 = ZEXT1632(auVar10);
    local_560 = vsubps_avx(local_440,local_460);
    auVar115._0_4_ = auVar10._0_4_ * local_480._0_4_;
    auVar115._4_4_ = auVar10._4_4_ * local_480._4_4_;
    auVar115._8_4_ = auVar10._8_4_ * local_480._8_4_;
    auVar115._12_4_ = auVar10._12_4_ * local_480._12_4_;
    auVar115._16_4_ = local_480._16_4_ * 0.0;
    auVar115._20_4_ = local_480._20_4_ * 0.0;
    auVar115._24_4_ = local_480._24_4_ * 0.0;
    auVar115._28_4_ = 0;
    fVar128 = local_560._0_4_;
    auVar137._0_4_ = auVar11._0_4_ * fVar128;
    fVar20 = local_560._4_4_;
    auVar137._4_4_ = auVar11._4_4_ * fVar20;
    fVar22 = local_560._8_4_;
    auVar137._8_4_ = auVar11._8_4_ * fVar22;
    fVar130 = local_560._12_4_;
    auVar137._12_4_ = auVar11._12_4_ * fVar130;
    fVar131 = local_560._16_4_;
    auVar137._16_4_ = fVar131 * 0.0;
    fVar132 = local_560._20_4_;
    auVar137._20_4_ = fVar132 * 0.0;
    fVar133 = local_560._24_4_;
    auVar137._24_4_ = fVar133 * 0.0;
    auVar137._28_4_ = 0;
    auVar23 = vsubps_avx(auVar115,auVar137);
    auVar10 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar108 = auVar10._0_8_;
    local_a0._8_8_ = uVar108;
    local_a0._0_8_ = uVar108;
    local_a0._16_8_ = uVar108;
    local_a0._24_8_ = uVar108;
    auVar11 = vpermilps_avx(auVar7,0xff);
    uVar108 = auVar11._0_8_;
    local_c0._8_8_ = uVar108;
    local_c0._0_8_ = uVar108;
    local_c0._16_8_ = uVar108;
    local_c0._24_8_ = uVar108;
    auVar11 = vpermilps_avx(auVar8,0xff);
    uVar108 = auVar11._0_8_;
    local_e0._8_8_ = uVar108;
    local_e0._0_8_ = uVar108;
    local_e0._16_8_ = uVar108;
    local_e0._24_8_ = uVar108;
    auVar11 = vpermilps_avx(auVar179,0xff);
    local_100 = auVar11._0_8_;
    fVar19 = auVar11._0_4_;
    fVar21 = auVar11._4_4_;
    auVar27._4_4_ = fVar203 * fVar21;
    auVar27._0_4_ = fVar134 * fVar19;
    auVar27._8_4_ = fVar204 * fVar19;
    auVar27._12_4_ = fVar205 * fVar21;
    auVar27._16_4_ = fVar219 * fVar19;
    auVar27._20_4_ = fVar220 * fVar21;
    auVar27._24_4_ = fVar221 * fVar19;
    auVar27._28_4_ = fVar129;
    auVar11 = vfmadd231ps_fma(auVar27,local_e0,auVar125);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,local_c0);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar141,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar28._4_4_ = fVar89 * fVar21;
    auVar28._0_4_ = fVar88 * fVar19;
    auVar28._8_4_ = fVar90 * fVar19;
    auVar28._12_4_ = fVar91 * fVar21;
    auVar28._16_4_ = fVar92 * fVar19;
    auVar28._20_4_ = fVar93 * fVar21;
    auVar28._24_4_ = fVar94 * fVar19;
    auVar28._28_4_ = auVar141._28_4_;
    auVar11 = vfmadd231ps_fma(auVar28,auVar124,local_e0);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar209,local_c0);
    auVar184 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar201,local_a0);
    auVar29._4_4_ = fVar20 * fVar20;
    auVar29._0_4_ = fVar128 * fVar128;
    auVar29._8_4_ = fVar22 * fVar22;
    auVar29._12_4_ = fVar130 * fVar130;
    auVar29._16_4_ = fVar131 * fVar131;
    auVar29._20_4_ = fVar132 * fVar132;
    auVar29._24_4_ = fVar133 * fVar133;
    auVar29._28_4_ = auVar10._4_4_;
    auVar10 = vfmadd231ps_fma(auVar29,local_480,local_480);
    auVar123 = vmaxps_avx(ZEXT1632(auVar109),ZEXT1632(auVar184));
    auVar30._4_4_ = auVar123._4_4_ * auVar123._4_4_ * auVar10._4_4_;
    auVar30._0_4_ = auVar123._0_4_ * auVar123._0_4_ * auVar10._0_4_;
    auVar30._8_4_ = auVar123._8_4_ * auVar123._8_4_ * auVar10._8_4_;
    auVar30._12_4_ = auVar123._12_4_ * auVar123._12_4_ * auVar10._12_4_;
    auVar30._16_4_ = auVar123._16_4_ * auVar123._16_4_ * 0.0;
    auVar30._20_4_ = auVar123._20_4_ * auVar123._20_4_ * 0.0;
    auVar30._24_4_ = auVar123._24_4_ * auVar123._24_4_ * 0.0;
    auVar30._28_4_ = auVar123._28_4_;
    auVar31._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar31._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar31._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar31._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar31._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar31._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar31._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar31._28_4_ = auVar23._28_4_;
    local_580._0_4_ = (undefined4)iVar98;
    local_580._4_12_ = auVar195._4_12_;
    auVar123 = vcmpps_avx(auVar31,auVar30,2);
    fVar128 = auVar9._0_4_ * 4.7683716e-07;
    local_580._16_16_ = auVar113._16_16_;
    auVar116._4_4_ = local_580._0_4_;
    auVar116._0_4_ = local_580._0_4_;
    auVar116._8_4_ = local_580._0_4_;
    auVar116._12_4_ = local_580._0_4_;
    auVar116._16_4_ = local_580._0_4_;
    auVar116._20_4_ = local_580._0_4_;
    auVar116._24_4_ = local_580._0_4_;
    auVar116._28_4_ = local_580._0_4_;
    auVar113 = vcmpps_avx(_DAT_01f7b060,auVar116,1);
    auVar10 = vpermilps_avx(auVar167,0xaa);
    uVar108 = auVar10._0_8_;
    local_4c0._8_8_ = uVar108;
    local_4c0._0_8_ = uVar108;
    local_4c0._16_8_ = uVar108;
    local_4c0._24_8_ = uVar108;
    auVar9 = vpermilps_avx(auVar190,0xaa);
    uVar108 = auVar9._0_8_;
    local_800._8_8_ = uVar108;
    local_800._0_8_ = uVar108;
    local_800._16_8_ = uVar108;
    local_800._24_8_ = uVar108;
    auVar234 = ZEXT3264(local_800);
    auVar11 = vpermilps_avx(auVar191,0xaa);
    uVar108 = auVar11._0_8_;
    auVar200._8_8_ = uVar108;
    auVar200._0_8_ = uVar108;
    auVar200._16_8_ = uVar108;
    auVar200._24_8_ = uVar108;
    auVar9 = vshufps_avx(auVar195,auVar195,0xaa);
    uVar108 = auVar9._0_8_;
    register0x00001508 = uVar108;
    local_7a0 = uVar108;
    register0x00001510 = uVar108;
    register0x00001518 = uVar108;
    auVar228 = ZEXT3264(_local_7a0);
    auVar23 = auVar113 & auVar123;
    uVar106 = *(undefined4 *)(ray + k * 4 + 0x60);
    local_5a0 = ZEXT416(uVar13);
    local_5c0 = ZEXT416(uVar99);
    local_890 = auVar7._0_8_;
    uStack_888 = auVar7._8_8_;
    local_8a0 = auVar8._0_8_;
    uStack_898 = auVar8._8_8_;
    local_8b0._0_4_ = auVar179._0_4_;
    fVar19 = (float)local_8b0;
    local_8b0._4_4_ = auVar179._4_4_;
    fVar20 = local_8b0._4_4_;
    uStack_8a8._0_4_ = auVar179._8_4_;
    fVar21 = (float)uStack_8a8;
    uStack_8a8._4_4_ = auVar179._12_4_;
    fVar22 = uStack_8a8._4_4_;
    local_8b0 = auVar179._0_8_;
    uStack_8a8 = auVar179._8_8_;
    uStack_738 = local_740;
    uStack_730 = local_740;
    uStack_728 = local_740;
    fStack_53c = local_540;
    fStack_538 = local_540;
    fStack_534 = local_540;
    fStack_530 = local_540;
    fStack_52c = local_540;
    fStack_528 = local_540;
    fStack_524 = local_540;
    local_5a0._0_4_ = uVar13;
    local_5c0._0_4_ = uVar99;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
      auVar152 = ZEXT3264(local_780);
      auVar171 = ZEXT3264(local_700);
    }
    else {
      local_680 = SUB84(pGVar15,0);
      uStack_67c = (undefined4)((ulong)pGVar15 >> 0x20);
      _local_4e0 = vandps_avx(auVar123,auVar113);
      fVar205 = auVar9._0_4_;
      fVar219 = auVar9._4_4_;
      auVar32._4_4_ = fVar219 * fVar89;
      auVar32._0_4_ = fVar205 * fVar88;
      auVar32._8_4_ = fVar205 * fVar90;
      auVar32._12_4_ = fVar219 * fVar91;
      auVar32._16_4_ = fVar205 * fVar92;
      auVar32._20_4_ = fVar219 * fVar93;
      auVar32._24_4_ = fVar205 * fVar94;
      auVar32._28_4_ = local_4e0._28_4_;
      auVar179 = vfmadd213ps_fma(auVar124,auVar200,auVar32);
      auVar179 = vfmadd213ps_fma(auVar209,local_800,ZEXT1632(auVar179));
      auVar179 = vfmadd213ps_fma(auVar201,local_4c0,ZEXT1632(auVar179));
      local_4a0._0_4_ = auVar97._0_4_;
      local_4a0._4_4_ = auVar97._4_4_;
      fStack_498 = auVar97._8_4_;
      fStack_494 = auVar97._12_4_;
      fStack_490 = auVar97._16_4_;
      fStack_48c = auVar97._20_4_;
      fStack_488 = auVar97._24_4_;
      auVar117._0_4_ = fVar205 * (float)local_4a0._0_4_;
      auVar117._4_4_ = fVar219 * (float)local_4a0._4_4_;
      auVar117._8_4_ = fVar205 * fStack_498;
      auVar117._12_4_ = fVar219 * fStack_494;
      auVar117._16_4_ = fVar205 * fStack_490;
      auVar117._20_4_ = fVar219 * fStack_48c;
      auVar117._24_4_ = fVar205 * fStack_488;
      auVar117._28_4_ = 0;
      auVar9 = vfmadd213ps_fma(auVar125,auVar200,auVar117);
      auVar9 = vfmadd213ps_fma(auVar121,local_800,ZEXT1632(auVar9));
      auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar104 + 0x1210);
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar104 + 0x1694);
      auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar104 + 0x1b18);
      fVar130 = *(float *)(bspline_basis0 + lVar104 + 0x1f9c);
      fVar131 = *(float *)(bspline_basis0 + lVar104 + 0x1fa0);
      fVar132 = *(float *)(bspline_basis0 + lVar104 + 0x1fa4);
      fVar133 = *(float *)(bspline_basis0 + lVar104 + 0x1fa8);
      fVar134 = *(float *)(bspline_basis0 + lVar104 + 0x1fac);
      fVar203 = *(float *)(bspline_basis0 + lVar104 + 0x1fb0);
      fVar204 = *(float *)(bspline_basis0 + lVar104 + 0x1fb4);
      auVar33._4_4_ = local_540 * fVar131;
      auVar33._0_4_ = local_540 * fVar130;
      auVar33._8_4_ = local_540 * fVar132;
      auVar33._12_4_ = local_540 * fVar133;
      auVar33._16_4_ = local_540 * fVar134;
      auVar33._20_4_ = local_540 * fVar203;
      auVar33._24_4_ = local_540 * fVar204;
      auVar33._28_4_ = auVar10._4_4_;
      auVar34._4_4_ = fVar131 * fVar129;
      auVar34._0_4_ = fVar130 * fVar153;
      auVar34._8_4_ = fVar132 * fVar153;
      auVar34._12_4_ = fVar133 * fVar129;
      auVar34._16_4_ = fVar134 * fVar153;
      auVar34._20_4_ = fVar203 * fVar129;
      auVar34._24_4_ = fVar204 * fVar153;
      auVar34._28_4_ = auVar11._4_4_;
      auVar35._4_4_ = fVar219 * fVar131;
      auVar35._0_4_ = fVar205 * fVar130;
      auVar35._8_4_ = fVar205 * fVar132;
      auVar35._12_4_ = fVar219 * fVar133;
      auVar35._16_4_ = fVar205 * fVar134;
      auVar35._20_4_ = fVar219 * fVar203;
      auVar35._24_4_ = fVar205 * fVar204;
      auVar35._28_4_ = fVar219;
      auVar11 = vfmadd231ps_fma(auVar33,auVar121,local_700);
      auVar167 = vfmadd231ps_fma(auVar34,auVar121,local_660);
      auVar190 = vfmadd231ps_fma(auVar35,auVar200,auVar121);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar186);
      auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar125,local_5e0);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),local_800,auVar125);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar113,auVar168);
      auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar113,local_640);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),local_4c0,auVar113);
      fVar130 = *(float *)(bspline_basis1 + lVar104 + 0x1f9c);
      fVar131 = *(float *)(bspline_basis1 + lVar104 + 0x1fa0);
      fVar132 = *(float *)(bspline_basis1 + lVar104 + 0x1fa4);
      fVar133 = *(float *)(bspline_basis1 + lVar104 + 0x1fa8);
      fVar134 = *(float *)(bspline_basis1 + lVar104 + 0x1fac);
      fVar203 = *(float *)(bspline_basis1 + lVar104 + 0x1fb0);
      fVar204 = *(float *)(bspline_basis1 + lVar104 + 0x1fb4);
      auVar125._4_4_ = local_540 * fVar131;
      auVar125._0_4_ = local_540 * fVar130;
      auVar125._8_4_ = local_540 * fVar132;
      auVar125._12_4_ = local_540 * fVar133;
      auVar125._16_4_ = local_540 * fVar134;
      auVar125._20_4_ = local_540 * fVar203;
      auVar125._24_4_ = local_540 * fVar204;
      auVar125._28_4_ = auVar10._4_4_;
      auVar36._4_4_ = fVar129 * fVar131;
      auVar36._0_4_ = fVar153 * fVar130;
      auVar36._8_4_ = fVar153 * fVar132;
      auVar36._12_4_ = fVar129 * fVar133;
      auVar36._16_4_ = fVar153 * fVar134;
      auVar36._20_4_ = fVar129 * fVar203;
      auVar36._24_4_ = fVar153 * fVar204;
      auVar36._28_4_ = local_540;
      auVar37._4_4_ = fVar131 * fVar219;
      auVar37._0_4_ = fVar130 * fVar205;
      auVar37._8_4_ = fVar132 * fVar205;
      auVar37._12_4_ = fVar133 * fVar219;
      auVar37._16_4_ = fVar134 * fVar205;
      auVar37._20_4_ = fVar203 * fVar219;
      auVar37._24_4_ = fVar204 * fVar205;
      auVar37._28_4_ = fVar129;
      auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar104 + 0x1b18);
      auVar10 = vfmadd231ps_fma(auVar125,auVar113,local_700);
      auVar191 = vfmadd231ps_fma(auVar36,auVar113,local_660);
      auVar195 = vfmadd231ps_fma(auVar37,auVar200,auVar113);
      auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar104 + 0x1694);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar113,auVar186);
      auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar113,local_5e0);
      auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar113,local_800);
      auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar104 + 0x1210);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar113,auVar168);
      auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar113,local_640);
      auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),local_4c0,auVar113);
      auVar113 = vandps_avx(local_280,ZEXT1632(auVar11));
      auVar125 = vandps_avx(ZEXT1632(auVar167),local_280);
      auVar125 = vmaxps_avx(auVar113,auVar125);
      auVar113 = vandps_avx(ZEXT1632(auVar190),local_280);
      auVar113 = vmaxps_avx(auVar125,auVar113);
      auVar138._4_4_ = fVar128;
      auVar138._0_4_ = fVar128;
      auVar138._8_4_ = fVar128;
      auVar138._12_4_ = fVar128;
      auVar138._16_4_ = fVar128;
      auVar138._20_4_ = fVar128;
      auVar138._24_4_ = fVar128;
      auVar138._28_4_ = fVar128;
      auVar113 = vcmpps_avx(auVar113,auVar138,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar11),local_480,auVar113);
      auVar124 = vblendvps_avx(ZEXT1632(auVar167),local_560,auVar113);
      auVar113 = vandps_avx(ZEXT1632(auVar10),local_280);
      auVar125 = vandps_avx(ZEXT1632(auVar191),local_280);
      auVar125 = vmaxps_avx(auVar113,auVar125);
      auVar113 = vandps_avx(ZEXT1632(auVar195),local_280);
      auVar113 = vmaxps_avx(auVar125,auVar113);
      auVar125 = vcmpps_avx(auVar113,auVar138,1);
      auVar113 = vblendvps_avx(ZEXT1632(auVar10),local_480,auVar125);
      auVar125 = vblendvps_avx(ZEXT1632(auVar191),local_560,auVar125);
      auVar9 = vfmadd213ps_fma(auVar141,local_4c0,ZEXT1632(auVar9));
      auVar10 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,auVar124);
      auVar141 = vrsqrtps_avx(ZEXT1632(auVar10));
      fVar153 = auVar141._0_4_;
      fVar129 = auVar141._4_4_;
      fVar130 = auVar141._8_4_;
      fVar131 = auVar141._12_4_;
      fVar132 = auVar141._16_4_;
      fVar133 = auVar141._20_4_;
      fVar134 = auVar141._24_4_;
      auVar38._4_4_ = fVar129 * fVar129 * fVar129 * auVar10._4_4_ * -0.5;
      auVar38._0_4_ = fVar153 * fVar153 * fVar153 * auVar10._0_4_ * -0.5;
      auVar38._8_4_ = fVar130 * fVar130 * fVar130 * auVar10._8_4_ * -0.5;
      auVar38._12_4_ = fVar131 * fVar131 * fVar131 * auVar10._12_4_ * -0.5;
      auVar38._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar38._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar38._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar38._28_4_ = 0;
      auVar233._8_4_ = 0x3fc00000;
      auVar233._0_8_ = 0x3fc000003fc00000;
      auVar233._12_4_ = 0x3fc00000;
      auVar233._16_4_ = 0x3fc00000;
      auVar233._20_4_ = 0x3fc00000;
      auVar233._24_4_ = 0x3fc00000;
      auVar233._28_4_ = 0x3fc00000;
      auVar10 = vfmadd231ps_fma(auVar38,auVar233,auVar141);
      fVar153 = auVar10._0_4_;
      fVar129 = auVar10._4_4_;
      auVar39._4_4_ = auVar124._4_4_ * fVar129;
      auVar39._0_4_ = auVar124._0_4_ * fVar153;
      fVar130 = auVar10._8_4_;
      auVar39._8_4_ = auVar124._8_4_ * fVar130;
      fVar131 = auVar10._12_4_;
      auVar39._12_4_ = auVar124._12_4_ * fVar131;
      auVar39._16_4_ = auVar124._16_4_ * 0.0;
      auVar39._20_4_ = auVar124._20_4_ * 0.0;
      auVar39._24_4_ = auVar124._24_4_ * 0.0;
      auVar39._28_4_ = auVar141._28_4_;
      auVar40._4_4_ = -auVar121._4_4_ * fVar129;
      auVar40._0_4_ = -auVar121._0_4_ * fVar153;
      auVar40._8_4_ = -auVar121._8_4_ * fVar130;
      auVar40._12_4_ = -auVar121._12_4_ * fVar131;
      auVar40._16_4_ = -auVar121._16_4_ * 0.0;
      auVar40._20_4_ = -auVar121._20_4_ * 0.0;
      auVar40._24_4_ = -auVar121._24_4_ * 0.0;
      auVar40._28_4_ = 0;
      auVar10 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar125,auVar125);
      auVar121 = vrsqrtps_avx(ZEXT1632(auVar10));
      auVar141 = ZEXT1632(CONCAT412(fVar131 * 0.0,
                                    CONCAT48(fVar130 * 0.0,CONCAT44(fVar129 * 0.0,fVar153 * 0.0))));
      fVar153 = auVar121._0_4_;
      fVar129 = auVar121._4_4_;
      fVar130 = auVar121._8_4_;
      fVar131 = auVar121._12_4_;
      fVar132 = auVar121._16_4_;
      fVar133 = auVar121._20_4_;
      fVar134 = auVar121._24_4_;
      auVar41._4_4_ = fVar129 * fVar129 * fVar129 * auVar10._4_4_ * -0.5;
      auVar41._0_4_ = fVar153 * fVar153 * fVar153 * auVar10._0_4_ * -0.5;
      auVar41._8_4_ = fVar130 * fVar130 * fVar130 * auVar10._8_4_ * -0.5;
      auVar41._12_4_ = fVar131 * fVar131 * fVar131 * auVar10._12_4_ * -0.5;
      auVar41._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar41._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar41._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar41._28_4_ = 0xbf000000;
      auVar10 = vfmadd231ps_fma(auVar41,auVar233,auVar121);
      fVar153 = auVar10._0_4_;
      fVar129 = auVar10._4_4_;
      auVar42._4_4_ = fVar129 * auVar125._4_4_;
      auVar42._0_4_ = fVar153 * auVar125._0_4_;
      fVar130 = auVar10._8_4_;
      auVar42._8_4_ = fVar130 * auVar125._8_4_;
      fVar131 = auVar10._12_4_;
      auVar42._12_4_ = fVar131 * auVar125._12_4_;
      auVar42._16_4_ = auVar125._16_4_ * 0.0;
      auVar42._20_4_ = auVar125._20_4_ * 0.0;
      auVar42._24_4_ = auVar125._24_4_ * 0.0;
      auVar42._28_4_ = 0;
      auVar43._4_4_ = fVar129 * -auVar113._4_4_;
      auVar43._0_4_ = fVar153 * -auVar113._0_4_;
      auVar43._8_4_ = fVar130 * -auVar113._8_4_;
      auVar43._12_4_ = fVar131 * -auVar113._12_4_;
      auVar43._16_4_ = -auVar113._16_4_ * 0.0;
      auVar43._20_4_ = -auVar113._20_4_ * 0.0;
      auVar43._24_4_ = -auVar113._24_4_ * 0.0;
      auVar43._28_4_ = 0x3fc00000;
      auVar44._28_4_ = auVar121._28_4_;
      auVar44._0_28_ =
           ZEXT1628(CONCAT412(fVar131 * 0.0,
                              CONCAT48(fVar130 * 0.0,CONCAT44(fVar129 * 0.0,fVar153 * 0.0))));
      auVar10 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar109),local_400);
      auVar113 = ZEXT1632(auVar109);
      auVar11 = vfmadd213ps_fma(auVar40,auVar113,local_460);
      auVar167 = vfmadd213ps_fma(auVar141,auVar113,ZEXT1632(auVar9));
      auVar195 = vfnmadd213ps_fma(auVar39,auVar113,local_400);
      auVar190 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar184),_local_420);
      auVar110 = vfnmadd213ps_fma(auVar40,auVar113,local_460);
      auVar113 = ZEXT1632(auVar184);
      auVar191 = vfmadd213ps_fma(auVar43,auVar113,local_440);
      auVar192 = ZEXT1632(auVar109);
      auVar223 = vfnmadd231ps_fma(ZEXT1632(auVar9),auVar192,auVar141);
      auVar9 = vfmadd213ps_fma(auVar44,auVar113,ZEXT1632(auVar179));
      auVar196 = vfnmadd213ps_fma(auVar42,auVar113,_local_420);
      auVar217 = vfnmadd213ps_fma(auVar43,auVar113,local_440);
      auVar225 = vfnmadd231ps_fma(ZEXT1632(auVar179),ZEXT1632(auVar184),auVar44);
      auVar113 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar110));
      auVar125 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar223));
      auVar163._0_4_ = auVar223._0_4_ * auVar113._0_4_;
      auVar163._4_4_ = auVar223._4_4_ * auVar113._4_4_;
      auVar163._8_4_ = auVar223._8_4_ * auVar113._8_4_;
      auVar163._12_4_ = auVar223._12_4_ * auVar113._12_4_;
      auVar163._16_4_ = auVar113._16_4_ * 0.0;
      auVar163._20_4_ = auVar113._20_4_ * 0.0;
      auVar163._24_4_ = auVar113._24_4_ * 0.0;
      auVar163._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar163,ZEXT1632(auVar110),auVar125);
      auVar45._4_4_ = auVar195._4_4_ * auVar125._4_4_;
      auVar45._0_4_ = auVar195._0_4_ * auVar125._0_4_;
      auVar45._8_4_ = auVar195._8_4_ * auVar125._8_4_;
      auVar45._12_4_ = auVar195._12_4_ * auVar125._12_4_;
      auVar45._16_4_ = auVar125._16_4_ * 0.0;
      auVar45._20_4_ = auVar125._20_4_ * 0.0;
      auVar45._24_4_ = auVar125._24_4_ * 0.0;
      auVar45._28_4_ = auVar125._28_4_;
      auVar201 = ZEXT1632(auVar195);
      auVar125 = vsubps_avx(ZEXT1632(auVar190),auVar201);
      auVar179 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar223),auVar125);
      auVar46._4_4_ = auVar110._4_4_ * auVar125._4_4_;
      auVar46._0_4_ = auVar110._0_4_ * auVar125._0_4_;
      auVar46._8_4_ = auVar110._8_4_ * auVar125._8_4_;
      auVar46._12_4_ = auVar110._12_4_ * auVar125._12_4_;
      auVar46._16_4_ = auVar125._16_4_ * 0.0;
      auVar46._20_4_ = auVar125._20_4_ * 0.0;
      auVar46._24_4_ = auVar125._24_4_ * 0.0;
      auVar46._28_4_ = auVar125._28_4_;
      auVar195 = vfmsub231ps_fma(auVar46,auVar201,auVar113);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar109));
      auVar144 = vcmpps_avx(ZEXT1632(auVar179),ZEXT832(0) << 0x20,2);
      auVar113 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar10),auVar144);
      auVar125 = vblendvps_avx(ZEXT1632(auVar217),ZEXT1632(auVar11),auVar144);
      auVar121 = vblendvps_avx(ZEXT1632(auVar225),ZEXT1632(auVar167),auVar144);
      auVar141 = vblendvps_avx(auVar201,ZEXT1632(auVar190),auVar144);
      auVar124 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar191),auVar144);
      auVar209 = vblendvps_avx(ZEXT1632(auVar223),ZEXT1632(auVar9),auVar144);
      auVar201 = vblendvps_avx(ZEXT1632(auVar190),auVar201,auVar144);
      auVar123 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar110),auVar144);
      auVar179 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
      auVar23 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar223),auVar144);
      auVar193 = vsubps_avx(auVar201,auVar113);
      auVar135 = vsubps_avx(auVar123,auVar125);
      auVar162 = vsubps_avx(auVar23,auVar121);
      auVar123 = vsubps_avx(auVar113,auVar141);
      auVar185 = vsubps_avx(auVar125,auVar124);
      auVar197 = vsubps_avx(auVar121,auVar209);
      auVar47._4_4_ = auVar162._4_4_ * auVar113._4_4_;
      auVar47._0_4_ = auVar162._0_4_ * auVar113._0_4_;
      auVar47._8_4_ = auVar162._8_4_ * auVar113._8_4_;
      auVar47._12_4_ = auVar162._12_4_ * auVar113._12_4_;
      auVar47._16_4_ = auVar162._16_4_ * auVar113._16_4_;
      auVar47._20_4_ = auVar162._20_4_ * auVar113._20_4_;
      auVar47._24_4_ = auVar162._24_4_ * auVar113._24_4_;
      auVar47._28_4_ = auVar23._28_4_;
      auVar9 = vfmsub231ps_fma(auVar47,auVar121,auVar193);
      auVar48._4_4_ = auVar193._4_4_ * auVar125._4_4_;
      auVar48._0_4_ = auVar193._0_4_ * auVar125._0_4_;
      auVar48._8_4_ = auVar193._8_4_ * auVar125._8_4_;
      auVar48._12_4_ = auVar193._12_4_ * auVar125._12_4_;
      auVar48._16_4_ = auVar193._16_4_ * auVar125._16_4_;
      auVar48._20_4_ = auVar193._20_4_ * auVar125._20_4_;
      auVar48._24_4_ = auVar193._24_4_ * auVar125._24_4_;
      auVar48._28_4_ = auVar201._28_4_;
      auVar10 = vfmsub231ps_fma(auVar48,auVar113,auVar135);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
      auVar118._0_4_ = auVar135._0_4_ * auVar121._0_4_;
      auVar118._4_4_ = auVar135._4_4_ * auVar121._4_4_;
      auVar118._8_4_ = auVar135._8_4_ * auVar121._8_4_;
      auVar118._12_4_ = auVar135._12_4_ * auVar121._12_4_;
      auVar118._16_4_ = auVar135._16_4_ * auVar121._16_4_;
      auVar118._20_4_ = auVar135._20_4_ * auVar121._20_4_;
      auVar118._24_4_ = auVar135._24_4_ * auVar121._24_4_;
      auVar118._28_4_ = 0;
      auVar10 = vfmsub231ps_fma(auVar118,auVar125,auVar162);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
      auVar119._0_4_ = auVar197._0_4_ * auVar141._0_4_;
      auVar119._4_4_ = auVar197._4_4_ * auVar141._4_4_;
      auVar119._8_4_ = auVar197._8_4_ * auVar141._8_4_;
      auVar119._12_4_ = auVar197._12_4_ * auVar141._12_4_;
      auVar119._16_4_ = auVar197._16_4_ * auVar141._16_4_;
      auVar119._20_4_ = auVar197._20_4_ * auVar141._20_4_;
      auVar119._24_4_ = auVar197._24_4_ * auVar141._24_4_;
      auVar119._28_4_ = 0;
      auVar9 = vfmsub231ps_fma(auVar119,auVar123,auVar209);
      auVar49._4_4_ = auVar185._4_4_ * auVar209._4_4_;
      auVar49._0_4_ = auVar185._0_4_ * auVar209._0_4_;
      auVar49._8_4_ = auVar185._8_4_ * auVar209._8_4_;
      auVar49._12_4_ = auVar185._12_4_ * auVar209._12_4_;
      auVar49._16_4_ = auVar185._16_4_ * auVar209._16_4_;
      auVar49._20_4_ = auVar185._20_4_ * auVar209._20_4_;
      auVar49._24_4_ = auVar185._24_4_ * auVar209._24_4_;
      auVar49._28_4_ = auVar209._28_4_;
      auVar11 = vfmsub231ps_fma(auVar49,auVar124,auVar197);
      auVar50._4_4_ = auVar123._4_4_ * auVar124._4_4_;
      auVar50._0_4_ = auVar123._0_4_ * auVar124._0_4_;
      auVar50._8_4_ = auVar123._8_4_ * auVar124._8_4_;
      auVar50._12_4_ = auVar123._12_4_ * auVar124._12_4_;
      auVar50._16_4_ = auVar123._16_4_ * auVar124._16_4_;
      auVar50._20_4_ = auVar123._20_4_ * auVar124._20_4_;
      auVar50._24_4_ = auVar123._24_4_ * auVar124._24_4_;
      auVar50._28_4_ = auVar124._28_4_;
      auVar109 = vfmsub231ps_fma(auVar50,auVar185,auVar141);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar141 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar11));
      auVar141 = vcmpps_avx(auVar141,ZEXT832(0) << 0x20,2);
      auVar9 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
      auVar179 = vpand_avx(auVar179,auVar9);
      auVar141 = vpmovsxwd_avx2(auVar179);
      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0x7f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0xbf,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar141[0x1f]) {
        auVar152 = ZEXT864(0) << 0x20;
LAB_01300746:
        auVar171 = ZEXT3264(CONCAT824(local_6c0[1]._24_8_,
                                      CONCAT816(local_6c0[1]._16_8_,
                                                CONCAT88(local_6c0[1]._8_8_,local_6c0[1]._0_8_))));
        auVar113 = vpcmpeqd_avx2(auVar123,auVar123);
        auVar210 = ZEXT3264(auVar113);
      }
      else {
        auVar51._4_4_ = auVar135._4_4_ * auVar197._4_4_;
        auVar51._0_4_ = auVar135._0_4_ * auVar197._0_4_;
        auVar51._8_4_ = auVar135._8_4_ * auVar197._8_4_;
        auVar51._12_4_ = auVar135._12_4_ * auVar197._12_4_;
        auVar51._16_4_ = auVar135._16_4_ * auVar197._16_4_;
        auVar51._20_4_ = auVar135._20_4_ * auVar197._20_4_;
        auVar51._24_4_ = auVar135._24_4_ * auVar197._24_4_;
        auVar51._28_4_ = auVar141._28_4_;
        auVar190 = vfmsub231ps_fma(auVar51,auVar185,auVar162);
        auVar139._0_4_ = auVar123._0_4_ * auVar162._0_4_;
        auVar139._4_4_ = auVar123._4_4_ * auVar162._4_4_;
        auVar139._8_4_ = auVar123._8_4_ * auVar162._8_4_;
        auVar139._12_4_ = auVar123._12_4_ * auVar162._12_4_;
        auVar139._16_4_ = auVar123._16_4_ * auVar162._16_4_;
        auVar139._20_4_ = auVar123._20_4_ * auVar162._20_4_;
        auVar139._24_4_ = auVar123._24_4_ * auVar162._24_4_;
        auVar139._28_4_ = 0;
        auVar167 = vfmsub231ps_fma(auVar139,auVar193,auVar197);
        auVar52._4_4_ = auVar193._4_4_ * auVar185._4_4_;
        auVar52._0_4_ = auVar193._0_4_ * auVar185._0_4_;
        auVar52._8_4_ = auVar193._8_4_ * auVar185._8_4_;
        auVar52._12_4_ = auVar193._12_4_ * auVar185._12_4_;
        auVar52._16_4_ = auVar193._16_4_ * auVar185._16_4_;
        auVar52._20_4_ = auVar193._20_4_ * auVar185._20_4_;
        auVar52._24_4_ = auVar193._24_4_ * auVar185._24_4_;
        auVar52._28_4_ = auVar193._28_4_;
        auVar191 = vfmsub231ps_fma(auVar52,auVar123,auVar135);
        auVar9 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar167),ZEXT1632(auVar191));
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar190),_DAT_01f7b000);
        auVar123 = vrcpps_avx(ZEXT1632(auVar109));
        auVar224._8_4_ = 0x3f800000;
        auVar224._0_8_ = 0x3f8000003f800000;
        auVar224._12_4_ = 0x3f800000;
        auVar224._16_4_ = 0x3f800000;
        auVar224._20_4_ = 0x3f800000;
        auVar224._24_4_ = 0x3f800000;
        auVar224._28_4_ = 0x3f800000;
        auVar9 = vfnmadd213ps_fma(auVar123,ZEXT1632(auVar109),auVar224);
        auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar123,auVar123);
        auVar53._4_4_ = auVar191._4_4_ * auVar121._4_4_;
        auVar53._0_4_ = auVar191._0_4_ * auVar121._0_4_;
        auVar53._8_4_ = auVar191._8_4_ * auVar121._8_4_;
        auVar53._12_4_ = auVar191._12_4_ * auVar121._12_4_;
        auVar53._16_4_ = auVar121._16_4_ * 0.0;
        auVar53._20_4_ = auVar121._20_4_ * 0.0;
        auVar53._24_4_ = auVar121._24_4_ * 0.0;
        auVar53._28_4_ = auVar121._28_4_;
        auVar167 = vfmadd231ps_fma(auVar53,auVar125,ZEXT1632(auVar167));
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT1632(auVar190),auVar113);
        fVar153 = auVar9._0_4_;
        fVar129 = auVar9._4_4_;
        fVar130 = auVar9._8_4_;
        fVar131 = auVar9._12_4_;
        auVar54._28_4_ = auVar125._28_4_;
        auVar54._0_28_ =
             ZEXT1628(CONCAT412(fVar131 * auVar167._12_4_,
                                CONCAT48(fVar130 * auVar167._8_4_,
                                         CONCAT44(fVar129 * auVar167._4_4_,fVar153 * auVar167._0_4_)
                                        )));
        auVar120._4_4_ = uVar106;
        auVar120._0_4_ = uVar106;
        auVar120._8_4_ = uVar106;
        auVar120._12_4_ = uVar106;
        auVar120._16_4_ = uVar106;
        auVar120._20_4_ = uVar106;
        auVar120._24_4_ = uVar106;
        auVar120._28_4_ = uVar106;
        uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar140._4_4_ = uVar222;
        auVar140._0_4_ = uVar222;
        auVar140._8_4_ = uVar222;
        auVar140._12_4_ = uVar222;
        auVar140._16_4_ = uVar222;
        auVar140._20_4_ = uVar222;
        auVar140._24_4_ = uVar222;
        auVar140._28_4_ = uVar222;
        auVar113 = vcmpps_avx(auVar120,auVar54,2);
        auVar125 = vcmpps_avx(auVar54,auVar140,2);
        auVar113 = vandps_avx(auVar125,auVar113);
        auVar9 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar179 = vpand_avx(auVar179,auVar9);
        auVar113 = vpmovsxwd_avx2(auVar179);
        auVar152 = ZEXT864(0) << 0x20;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0x7f,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0xbf,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar113[0x1f]) goto LAB_01300746;
        auVar113 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar109),4);
        auVar9 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar179 = vpand_avx(auVar179,auVar9);
        auVar125 = vpmovsxwd_avx2(auVar179);
        auVar171 = ZEXT3264(CONCAT824(local_6c0[1]._24_8_,
                                      CONCAT816(local_6c0[1]._16_8_,
                                                CONCAT88(local_6c0[1]._8_8_,local_6c0[1]._0_8_))));
        auVar113 = vpcmpeqd_avx2(auVar123,auVar123);
        auVar210 = ZEXT3264(auVar113);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0x7f,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar125 >> 0xbf,0) != '\0') ||
            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar125[0x1f] < '\0') {
          auVar121 = ZEXT1632(CONCAT412(fVar131 * auVar10._12_4_,
                                        CONCAT48(fVar130 * auVar10._8_4_,
                                                 CONCAT44(fVar129 * auVar10._4_4_,
                                                          fVar153 * auVar10._0_4_))));
          auVar141 = ZEXT1632(CONCAT412(fVar131 * auVar11._12_4_,
                                        CONCAT48(fVar130 * auVar11._8_4_,
                                                 CONCAT44(fVar129 * auVar11._4_4_,
                                                          fVar153 * auVar11._0_4_))));
          auVar182._8_4_ = 0x3f800000;
          auVar182._0_8_ = 0x3f8000003f800000;
          auVar182._12_4_ = 0x3f800000;
          auVar182._16_4_ = 0x3f800000;
          auVar182._20_4_ = 0x3f800000;
          auVar182._24_4_ = 0x3f800000;
          auVar182._28_4_ = 0x3f800000;
          auVar113 = vsubps_avx(auVar182,auVar121);
          _local_260 = vblendvps_avx(auVar113,auVar121,auVar144);
          auVar113 = vsubps_avx(auVar182,auVar141);
          local_500 = vblendvps_avx(auVar113,auVar141,auVar144);
          auVar171 = ZEXT3264(auVar125);
          local_600 = auVar54;
        }
      }
      auVar234 = ZEXT3264(local_800);
      auVar228 = ZEXT3264(_local_7a0);
      auVar113 = auVar171._0_32_;
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0x7f,0) == '\0') &&
            (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar113 >> 0xbf,0) == '\0') &&
          (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar171[0x1f]) {
        auVar152 = ZEXT3264(local_780);
        auVar171 = ZEXT3264(local_700);
      }
      else {
        auVar125 = vsubps_avx(ZEXT1632(auVar184),auVar192);
        auVar179 = vfmadd213ps_fma(auVar125,_local_260,auVar192);
        fVar153 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar55._4_4_ = (auVar179._4_4_ + auVar179._4_4_) * fVar153;
        auVar55._0_4_ = (auVar179._0_4_ + auVar179._0_4_) * fVar153;
        auVar55._8_4_ = (auVar179._8_4_ + auVar179._8_4_) * fVar153;
        auVar55._12_4_ = (auVar179._12_4_ + auVar179._12_4_) * fVar153;
        auVar55._16_4_ = fVar153 * 0.0;
        auVar55._20_4_ = fVar153 * 0.0;
        auVar55._24_4_ = fVar153 * 0.0;
        auVar55._28_4_ = 0;
        auVar125 = vcmpps_avx(local_600,auVar55,6);
        auVar121 = auVar113 & auVar125;
        auVar171 = ZEXT3264(auVar200);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar142._8_4_ = 0xbf800000;
          auVar142._0_8_ = 0xbf800000bf800000;
          auVar142._12_4_ = 0xbf800000;
          auVar142._16_4_ = 0xbf800000;
          auVar142._20_4_ = 0xbf800000;
          auVar142._24_4_ = 0xbf800000;
          auVar142._28_4_ = 0xbf800000;
          auVar164._8_4_ = 0x40000000;
          auVar164._0_8_ = 0x4000000040000000;
          auVar164._12_4_ = 0x40000000;
          auVar164._16_4_ = 0x40000000;
          auVar164._20_4_ = 0x40000000;
          auVar164._24_4_ = 0x40000000;
          auVar164._28_4_ = 0x40000000;
          auVar179 = vfmadd213ps_fma(local_500,auVar164,auVar142);
          local_3e0 = _local_260;
          local_3c0 = ZEXT1632(auVar179);
          local_3a0 = local_600;
          local_380 = 0;
          local_360 = local_890;
          uStack_358 = uStack_888;
          local_350 = local_8a0;
          uStack_348 = uStack_898;
          local_340 = local_8b0;
          uStack_338 = uStack_8a8;
          local_500 = local_3c0;
          if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_6e0 = vandps_avx(auVar125,auVar113);
            fVar153 = 1.0 / (float)local_580._0_4_;
            local_300[0] = fVar153 * ((float)local_260._0_4_ + 0.0);
            local_300[1] = fVar153 * ((float)local_260._4_4_ + 1.0);
            local_300[2] = fVar153 * (fStack_258 + 2.0);
            local_300[3] = fVar153 * (fStack_254 + 3.0);
            fStack_2f0 = fVar153 * (fStack_250 + 4.0);
            fStack_2ec = fVar153 * (fStack_24c + 5.0);
            fStack_2e8 = fVar153 * (fStack_248 + 6.0);
            fStack_2e4 = fStack_244 + 7.0;
            local_500._0_8_ = auVar179._0_8_;
            local_500._8_8_ = auVar179._8_8_;
            local_2e0 = local_500._0_8_;
            uStack_2d8 = local_500._8_8_;
            uStack_2d0 = 0;
            uStack_2c8 = 0;
            local_2c0 = local_600;
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar113 = vblendvps_avx(auVar143,local_600,local_6e0);
            auVar125 = vshufps_avx(auVar113,auVar113,0xb1);
            auVar125 = vminps_avx(auVar113,auVar125);
            auVar121 = vshufpd_avx(auVar125,auVar125,5);
            auVar125 = vminps_avx(auVar125,auVar121);
            auVar121 = vpermpd_avx2(auVar125,0x4e);
            auVar125 = vminps_avx(auVar125,auVar121);
            auVar125 = vcmpps_avx(auVar113,auVar125,0);
            auVar121 = local_6e0 & auVar125;
            auVar113 = local_6e0;
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar113 = vandps_avx(auVar125,local_6e0);
            }
            uVar100 = vmovmskps_avx(auVar113);
            uVar24 = 0;
            for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
              uVar24 = uVar24 + 1;
            }
            uVar102 = (ulong)uVar24;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar153 = local_300[uVar102];
              uVar222 = *(undefined4 *)((long)&local_2e0 + uVar102 * 4);
              fVar129 = 1.0 - fVar153;
              auVar174 = ZEXT416((uint)(fVar153 * fVar129 * 4.0));
              auVar179 = vfnmsub213ss_fma(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),auVar174);
              auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),auVar174);
              fVar129 = fVar129 * -fVar129 * 0.5;
              fVar130 = auVar179._0_4_ * 0.5;
              fVar131 = auVar174._0_4_ * 0.5;
              fVar132 = fVar153 * fVar153 * 0.5;
              auVar172._0_4_ = fVar132 * fVar19;
              auVar172._4_4_ = fVar132 * fVar20;
              auVar172._8_4_ = fVar132 * fVar21;
              auVar172._12_4_ = fVar132 * fVar22;
              auVar154._4_4_ = fVar131;
              auVar154._0_4_ = fVar131;
              auVar154._8_4_ = fVar131;
              auVar154._12_4_ = fVar131;
              auVar174 = vfmadd132ps_fma(auVar154,auVar172,auVar8);
              auVar173._4_4_ = fVar130;
              auVar173._0_4_ = fVar130;
              auVar173._8_4_ = fVar130;
              auVar173._12_4_ = fVar130;
              auVar174 = vfmadd132ps_fma(auVar173,auVar174,auVar7);
              auVar155._4_4_ = fVar129;
              auVar155._0_4_ = fVar129;
              auVar155._8_4_ = fVar129;
              auVar155._12_4_ = fVar129;
              auVar174 = vfmadd132ps_fma(auVar155,auVar174,*(undefined1 (*) [16])pPVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar102 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar174._0_4_;
              uVar14 = vextractps_avx(auVar174,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar14;
              uVar14 = vextractps_avx(auVar174,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar14;
              *(float *)(ray + k * 4 + 0x1e0) = fVar153;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar222;
              *(uint *)(ray + k * 4 + 0x220) = uVar99;
              *(uint *)(ray + k * 4 + 0x240) = uVar13;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_7e0._4_4_ = uVar13;
              local_7e0._0_4_ = uVar13;
              local_7e0._8_4_ = uVar13;
              local_7e0._12_4_ = uVar13;
              local_7e0._16_4_ = uVar13;
              local_7e0._20_4_ = uVar13;
              local_7e0._24_4_ = uVar13;
              local_7e0._28_4_ = uVar13;
              local_720._4_4_ = uVar99;
              local_720._0_4_ = uVar99;
              local_720._8_4_ = uVar99;
              local_720._12_4_ = uVar99;
              local_720._16_4_ = uVar99;
              local_720._20_4_ = uVar99;
              local_720._24_4_ = uVar99;
              local_720._28_4_ = uVar99;
              uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_760 = auVar200;
              _local_4a0 = *pauVar2;
              local_37c = iVar98;
              local_370 = uVar183;
              uStack_368 = uVar95;
              while( true ) {
                fVar153 = local_300[uVar102];
                auVar112._4_4_ = fVar153;
                auVar112._0_4_ = fVar153;
                auVar112._8_4_ = fVar153;
                auVar112._12_4_ = fVar153;
                local_1e0._16_4_ = fVar153;
                local_1e0._0_16_ = auVar112;
                local_1e0._20_4_ = fVar153;
                local_1e0._24_4_ = fVar153;
                local_1e0._28_4_ = fVar153;
                local_1c0 = *(undefined4 *)((long)&local_2e0 + uVar102 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar102 * 4);
                fVar130 = 1.0 - fVar153;
                auVar179 = ZEXT416((uint)(fVar153 * fVar130 * 4.0));
                auVar9 = vfnmsub213ss_fma(auVar112,auVar112,auVar179);
                auVar179 = vfmadd213ss_fma(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),auVar179);
                fVar129 = auVar179._0_4_ * 0.5;
                fVar153 = fVar153 * fVar153 * 0.5;
                auVar180._0_4_ = fVar153 * fVar19;
                auVar180._4_4_ = fVar153 * fVar20;
                auVar180._8_4_ = fVar153 * fVar21;
                auVar180._12_4_ = fVar153 * fVar22;
                auVar160._4_4_ = fVar129;
                auVar160._0_4_ = fVar129;
                auVar160._8_4_ = fVar129;
                auVar160._12_4_ = fVar129;
                auVar179 = vfmadd132ps_fma(auVar160,auVar180,auVar8);
                fVar153 = auVar9._0_4_ * 0.5;
                auVar181._4_4_ = fVar153;
                auVar181._0_4_ = fVar153;
                auVar181._8_4_ = fVar153;
                auVar181._12_4_ = fVar153;
                auVar179 = vfmadd132ps_fma(auVar181,auVar179,auVar7);
                local_830.context = context->user;
                fVar153 = fVar130 * -fVar130 * 0.5;
                auVar161._4_4_ = fVar153;
                auVar161._0_4_ = fVar153;
                auVar161._8_4_ = fVar153;
                auVar161._12_4_ = fVar153;
                auVar9 = vfmadd132ps_fma(auVar161,auVar179,auVar174);
                local_240 = auVar9._0_4_;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                auVar179 = vmovshdup_avx(auVar9);
                local_220 = auVar179._0_8_;
                uStack_218 = local_220;
                uStack_210 = local_220;
                uStack_208 = local_220;
                auVar179 = vshufps_avx(auVar9,auVar9,0xaa);
                local_200 = auVar179._0_8_;
                uStack_1f8 = local_200;
                uStack_1f0 = local_200;
                uStack_1e8 = local_200;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = local_720._0_8_;
                uStack_198 = local_720._8_8_;
                uStack_190 = local_720._16_8_;
                uStack_188 = local_720._24_8_;
                local_180 = local_7e0._0_8_;
                uStack_178 = local_7e0._8_8_;
                uStack_170 = local_7e0._16_8_;
                uStack_168 = local_7e0._24_8_;
                local_7a8[1] = auVar210._0_32_;
                *local_7a8 = auVar210._0_32_;
                local_160 = (local_830.context)->instID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_140 = (local_830.context)->instPrimID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_6c0[0] = local_2a0;
                local_830.valid = (int *)local_6c0;
                local_830.geometryUserPtr = *(void **)(CONCAT44(uStack_67c,local_680) + 0x18);
                local_830.hit = (RTCHitN *)&local_240;
                local_830.N = 8;
                pcVar17 = *(code **)(CONCAT44(uStack_67c,local_680) + 0x40);
                local_830.ray = (RTCRayN *)ray;
                if (pcVar17 != (code *)0x0) {
                  auVar113 = ZEXT1632(auVar210._0_16_);
                  (*pcVar17)(&local_830);
                  auVar228 = ZEXT3264(_local_7a0);
                  auVar171 = ZEXT3264(local_760);
                  auVar234 = ZEXT3264(local_800);
                  auVar113 = vpcmpeqd_avx2(auVar113,auVar113);
                  auVar210 = ZEXT3264(auVar113);
                  auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar125 = vpcmpeqd_avx2(auVar152._0_32_,local_6c0[0]);
                auVar113 = auVar210._0_32_ & ~auVar125;
                if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar113 >> 0x7f,0) == '\0') &&
                      (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar113 >> 0xbf,0) == '\0') &&
                    (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar113[0x1f]) {
                  auVar125 = auVar210._0_32_ ^ auVar125;
                }
                else {
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_67c,local_680) + 0x3e) & 0x40) != 0)))) {
                    auVar113 = ZEXT1632(auVar210._0_16_);
                    (*p_Var16)(&local_830);
                    auVar228 = ZEXT3264(_local_7a0);
                    auVar171 = ZEXT3264(local_760);
                    auVar234 = ZEXT3264(local_800);
                    auVar113 = vpcmpeqd_avx2(auVar113,auVar113);
                    auVar210 = ZEXT3264(auVar113);
                    auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar121 = vpcmpeqd_avx2(auVar152._0_32_,local_6c0[0]);
                  auVar125 = auVar210._0_32_ ^ auVar121;
                  auVar113 = auVar210._0_32_ & ~auVar121;
                  if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar113 >> 0x7f,0) != '\0') ||
                        (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar113 >> 0xbf,0) != '\0') ||
                      (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar113[0x1f] < '\0') {
                    auVar150._0_4_ = auVar210._0_4_ ^ auVar121._0_4_;
                    auVar150._4_4_ = auVar210._4_4_ ^ auVar121._4_4_;
                    auVar150._8_4_ = auVar210._8_4_ ^ auVar121._8_4_;
                    auVar150._12_4_ = auVar210._12_4_ ^ auVar121._12_4_;
                    auVar150._16_4_ = auVar210._16_4_ ^ auVar121._16_4_;
                    auVar150._20_4_ = auVar210._20_4_ ^ auVar121._20_4_;
                    auVar150._24_4_ = auVar210._24_4_ ^ auVar121._24_4_;
                    auVar150._28_4_ = auVar210._28_4_ ^ auVar121._28_4_;
                    auVar113 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])local_830.hit);
                    *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar113;
                    auVar113 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_830.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar113;
                    auVar113 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_830.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar113;
                    auVar113 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_830.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar113;
                    auVar113 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_830.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar113;
                    auVar113 = vpmaskmovd_avx2(auVar150,*(undefined1 (*) [32])(local_830.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar113;
                    auVar113 = vpmaskmovd_avx2(auVar150,*(undefined1 (*) [32])(local_830.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar113;
                    auVar113 = vpmaskmovd_avx2(auVar150,*(undefined1 (*) [32])(local_830.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar113;
                    auVar113 = vpmaskmovd_avx2(auVar150,*(undefined1 (*) [32])
                                                         (local_830.hit + 0x100));
                    *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar113;
                  }
                }
                auVar113 = local_600;
                auVar200 = auVar171._0_32_;
                if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar125 >> 0x7f,0) == '\0') &&
                      (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar125 >> 0xbf,0) == '\0') &&
                    (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar125[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar222;
                }
                else {
                  uVar222 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_6e0 + uVar102 * 4) = 0;
                auVar127._4_4_ = uVar222;
                auVar127._0_4_ = uVar222;
                auVar127._8_4_ = uVar222;
                auVar127._12_4_ = uVar222;
                auVar127._16_4_ = uVar222;
                auVar127._20_4_ = uVar222;
                auVar127._24_4_ = uVar222;
                auVar127._28_4_ = uVar222;
                auVar121 = vcmpps_avx(auVar113,auVar127,2);
                auVar125 = vandps_avx(auVar121,local_6e0);
                local_6e0 = local_6e0 & auVar121;
                if ((((((((local_6e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_6e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_6e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_6e0 >> 0x7f,0) == '\0') &&
                      (local_6e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_6e0 >> 0xbf,0) == '\0') &&
                    (local_6e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_6e0[0x1f]) break;
                auVar151._8_4_ = 0x7f800000;
                auVar151._0_8_ = 0x7f8000007f800000;
                auVar151._12_4_ = 0x7f800000;
                auVar151._16_4_ = 0x7f800000;
                auVar151._20_4_ = 0x7f800000;
                auVar151._24_4_ = 0x7f800000;
                auVar151._28_4_ = 0x7f800000;
                auVar113 = vblendvps_avx(auVar151,auVar113,auVar125);
                auVar121 = vshufps_avx(auVar113,auVar113,0xb1);
                auVar121 = vminps_avx(auVar113,auVar121);
                auVar141 = vshufpd_avx(auVar121,auVar121,5);
                auVar121 = vminps_avx(auVar121,auVar141);
                auVar141 = vpermpd_avx2(auVar121,0x4e);
                auVar121 = vminps_avx(auVar121,auVar141);
                auVar121 = vcmpps_avx(auVar113,auVar121,0);
                auVar141 = auVar125 & auVar121;
                auVar113 = auVar125;
                if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar141 >> 0x7f,0) != '\0') ||
                      (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar141 >> 0xbf,0) != '\0') ||
                    (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar141[0x1f] < '\0') {
                  auVar113 = vandps_avx(auVar121,auVar125);
                }
                uVar100 = vmovmskps_avx(auVar113);
                uVar24 = 0;
                for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
                  uVar24 = uVar24 + 1;
                }
                uVar102 = (ulong)uVar24;
                local_6e0 = auVar125;
              }
            }
          }
        }
        auVar152 = ZEXT3264(local_780);
        auVar171 = ZEXT3264(local_700);
      }
    }
    auVar218 = ZEXT3264(local_660);
    auVar210 = ZEXT3264(CONCAT428(fStack_524,
                                  CONCAT424(fStack_528,
                                            CONCAT420(fStack_52c,
                                                      CONCAT416(fStack_530,
                                                                CONCAT412(fStack_534,
                                                                          CONCAT48(fStack_538,
                                                                                   CONCAT44(
                                                  fStack_53c,local_540))))))));
    if (8 < iVar98) {
      local_480._4_4_ = iVar98;
      local_480._0_4_ = iVar98;
      local_480._8_4_ = iVar98;
      local_480._12_4_ = iVar98;
      local_480._16_4_ = iVar98;
      local_480._20_4_ = iVar98;
      local_480._24_4_ = iVar98;
      local_480._28_4_ = iVar98;
      local_4e0._4_4_ = fVar128;
      local_4e0._0_4_ = fVar128;
      fStack_4d8 = fVar128;
      fStack_4d4 = fVar128;
      fStack_4d0 = fVar128;
      fStack_4cc = fVar128;
      fStack_4c8 = fVar128;
      fStack_4c4 = fVar128;
      local_120 = 1.0 / (float)local_580._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_5a0._4_4_ = local_5a0._0_4_;
      local_5a0._8_4_ = local_5a0._0_4_;
      local_5a0._12_4_ = local_5a0._0_4_;
      uStack_590 = local_5a0._0_4_;
      uStack_58c = local_5a0._0_4_;
      uStack_588 = local_5a0._0_4_;
      uStack_584 = local_5a0._0_4_;
      local_5c0._4_4_ = local_5c0._0_4_;
      local_5c0._8_4_ = local_5c0._0_4_;
      local_5c0._12_4_ = local_5c0._0_4_;
      uStack_5b0 = local_5c0._0_4_;
      uStack_5ac = local_5c0._0_4_;
      uStack_5a8 = local_5c0._0_4_;
      uStack_5a4 = local_5c0._0_4_;
      local_800 = auVar234._0_32_;
      _local_7a0 = auVar228._0_32_;
      fVar153 = (float)local_740;
      fVar128 = local_740._4_4_;
      fVar129 = (float)uStack_738;
      fVar130 = uStack_738._4_4_;
      fVar131 = (float)uStack_730;
      fVar132 = uStack_730._4_4_;
      fVar133 = (float)uStack_728;
      uVar222 = uStack_728._4_4_;
      local_760 = auVar200;
      local_680 = uVar106;
      uStack_67c = uVar106;
      uStack_678 = uVar106;
      uStack_674 = uVar106;
      uStack_670 = uVar106;
      uStack_66c = uVar106;
      uStack_668 = uVar106;
      uStack_664 = uVar106;
      for (lVar105 = 8; local_780 = auVar152._0_32_, lVar105 < iVar98; lVar105 = lVar105 + 8) {
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar105 * 4 + lVar104);
        auVar125 = *(undefined1 (*) [32])(lVar104 + 0x21fffac + lVar105 * 4);
        auVar121 = *(undefined1 (*) [32])(lVar104 + 0x2200430 + lVar105 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar104 + 0x22008b4 + lVar105 * 4);
        fVar134 = *(float *)*pauVar2;
        fVar203 = *(float *)(*pauVar2 + 4);
        fVar204 = *(float *)(*pauVar2 + 8);
        fVar205 = *(float *)(*pauVar2 + 0xc);
        fVar219 = *(float *)(*pauVar2 + 0x10);
        fVar220 = *(float *)(*pauVar2 + 0x14);
        fVar221 = *(float *)(*pauVar2 + 0x18);
        auVar97 = *(undefined1 (*) [28])*pauVar2;
        fVar206 = auVar210._0_4_;
        auVar229._0_4_ = fVar206 * fVar134;
        fVar211 = auVar210._4_4_;
        auVar229._4_4_ = fVar211 * fVar203;
        fVar212 = auVar210._8_4_;
        auVar229._8_4_ = fVar212 * fVar204;
        fVar213 = auVar210._12_4_;
        auVar229._12_4_ = fVar213 * fVar205;
        fVar214 = auVar210._16_4_;
        auVar229._16_4_ = fVar214 * fVar219;
        fVar215 = auVar210._20_4_;
        auVar229._20_4_ = fVar215 * fVar220;
        fVar216 = auVar210._24_4_;
        auVar229._28_36_ = auVar228._28_36_;
        auVar229._24_4_ = fVar216 * fVar221;
        auVar235._0_4_ = fVar134 * fVar153;
        auVar235._4_4_ = fVar203 * fVar128;
        auVar235._8_4_ = fVar204 * fVar129;
        auVar235._12_4_ = fVar205 * fVar130;
        auVar235._16_4_ = fVar219 * fVar131;
        auVar235._20_4_ = fVar220 * fVar132;
        auVar235._28_36_ = auVar234._28_36_;
        auVar235._24_4_ = fVar221 * fVar133;
        auVar174 = vfmadd231ps_fma(auVar229._0_32_,auVar121,auVar171._0_32_);
        auVar135 = auVar218._0_32_;
        auVar179 = vfmadd231ps_fma(auVar235._0_32_,auVar121,auVar135);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar125,auVar186);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar125,local_5e0);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar113,auVar168);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar113,local_640);
        auVar141 = *(undefined1 (*) [32])(bspline_basis1 + lVar105 * 4 + lVar104);
        auVar124 = *(undefined1 (*) [32])(lVar104 + 0x22023cc + lVar105 * 4);
        auVar209 = *(undefined1 (*) [32])(lVar104 + 0x2202850 + lVar105 * 4);
        pfVar3 = (float *)(lVar104 + 0x2202cd4 + lVar105 * 4);
        fVar88 = *pfVar3;
        fVar89 = pfVar3[1];
        fVar90 = pfVar3[2];
        fVar91 = pfVar3[3];
        fVar92 = pfVar3[4];
        fVar93 = pfVar3[5];
        fVar94 = pfVar3[6];
        auVar56._4_4_ = fVar211 * fVar89;
        auVar56._0_4_ = fVar206 * fVar88;
        auVar56._8_4_ = fVar212 * fVar90;
        auVar56._12_4_ = fVar213 * fVar91;
        auVar56._16_4_ = fVar214 * fVar92;
        auVar56._20_4_ = fVar215 * fVar93;
        auVar56._24_4_ = fVar216 * fVar94;
        auVar56._28_4_ = auVar113._28_4_;
        auVar57._4_4_ = fVar128 * fVar89;
        auVar57._0_4_ = fVar153 * fVar88;
        auVar57._8_4_ = fVar129 * fVar90;
        auVar57._12_4_ = fVar130 * fVar91;
        auVar57._16_4_ = fVar131 * fVar92;
        auVar57._20_4_ = fVar132 * fVar93;
        auVar57._24_4_ = fVar133 * fVar94;
        auVar57._28_4_ = uVar222;
        auVar9 = vfmadd231ps_fma(auVar56,auVar209,auVar171._0_32_);
        auVar10 = vfmadd231ps_fma(auVar57,auVar209,auVar135);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar124,auVar186);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,local_5e0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar141,auVar168);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar141,local_640);
        auVar193 = ZEXT1632(auVar9);
        local_400 = ZEXT1632(auVar174);
        local_440 = vsubps_avx(auVar193,local_400);
        auVar144 = ZEXT1632(auVar10);
        local_720 = ZEXT1632(auVar179);
        local_460 = vsubps_avx(auVar144,local_720);
        auVar58._4_4_ = auVar179._4_4_ * local_440._4_4_;
        auVar58._0_4_ = auVar179._0_4_ * local_440._0_4_;
        auVar58._8_4_ = auVar179._8_4_ * local_440._8_4_;
        auVar58._12_4_ = auVar179._12_4_ * local_440._12_4_;
        auVar58._16_4_ = local_440._16_4_ * 0.0;
        auVar58._20_4_ = local_440._20_4_ * 0.0;
        auVar58._24_4_ = local_440._24_4_ * 0.0;
        auVar58._28_4_ = local_640._28_4_;
        fVar153 = local_460._0_4_;
        auVar145._0_4_ = auVar174._0_4_ * fVar153;
        fVar128 = local_460._4_4_;
        auVar145._4_4_ = auVar174._4_4_ * fVar128;
        fVar129 = local_460._8_4_;
        auVar145._8_4_ = auVar174._8_4_ * fVar129;
        fVar130 = local_460._12_4_;
        auVar145._12_4_ = auVar174._12_4_ * fVar130;
        fVar131 = local_460._16_4_;
        auVar145._16_4_ = fVar131 * 0.0;
        fVar132 = local_460._20_4_;
        auVar145._20_4_ = fVar132 * 0.0;
        fVar133 = local_460._24_4_;
        auVar145._24_4_ = fVar133 * 0.0;
        auVar145._28_4_ = 0;
        auVar228 = ZEXT3264(auVar121);
        auVar123 = vsubps_avx(auVar58,auVar145);
        auVar59._4_4_ = local_100._4_4_ * fVar203;
        auVar59._0_4_ = (float)local_100 * fVar134;
        auVar59._8_4_ = (float)uStack_f8 * fVar204;
        auVar59._12_4_ = uStack_f8._4_4_ * fVar205;
        auVar59._16_4_ = (float)uStack_f0 * fVar219;
        auVar59._20_4_ = uStack_f0._4_4_ * fVar220;
        auVar59._24_4_ = (float)uStack_e8 * fVar221;
        auVar59._28_4_ = 0;
        auVar174 = vfmadd231ps_fma(auVar59,auVar121,local_e0);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),local_c0,auVar125);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),local_a0,auVar113);
        auVar60._4_4_ = local_100._4_4_ * fVar89;
        auVar60._0_4_ = (float)local_100 * fVar88;
        auVar60._8_4_ = (float)uStack_f8 * fVar90;
        auVar60._12_4_ = uStack_f8._4_4_ * fVar91;
        auVar60._16_4_ = (float)uStack_f0 * fVar92;
        auVar60._20_4_ = uStack_f0._4_4_ * fVar93;
        auVar60._24_4_ = (float)uStack_e8 * fVar94;
        auVar60._28_4_ = uStack_e8._4_4_;
        auVar179 = vfmadd231ps_fma(auVar60,auVar209,local_e0);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar124,local_c0);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar141,local_a0);
        auVar234 = ZEXT1664(auVar179);
        auVar152._0_4_ = fVar153 * fVar153;
        auVar152._4_4_ = fVar128 * fVar128;
        auVar152._8_4_ = fVar129 * fVar129;
        auVar152._12_4_ = fVar130 * fVar130;
        auVar152._16_4_ = fVar131 * fVar131;
        auVar152._20_4_ = fVar132 * fVar132;
        auVar152._28_36_ = auVar210._28_36_;
        auVar152._24_4_ = fVar133 * fVar133;
        auVar9 = vfmadd231ps_fma(auVar152._0_32_,local_440,local_440);
        local_560 = ZEXT1632(auVar174);
        auVar162 = ZEXT1632(auVar179);
        auVar201 = vmaxps_avx(local_560,auVar162);
        auVar207._0_4_ = auVar201._0_4_ * auVar201._0_4_ * auVar9._0_4_;
        auVar207._4_4_ = auVar201._4_4_ * auVar201._4_4_ * auVar9._4_4_;
        auVar207._8_4_ = auVar201._8_4_ * auVar201._8_4_ * auVar9._8_4_;
        auVar207._12_4_ = auVar201._12_4_ * auVar201._12_4_ * auVar9._12_4_;
        auVar207._16_4_ = auVar201._16_4_ * auVar201._16_4_ * 0.0;
        auVar207._20_4_ = auVar201._20_4_ * auVar201._20_4_ * 0.0;
        auVar207._24_4_ = auVar201._24_4_ * auVar201._24_4_ * 0.0;
        auVar207._28_4_ = 0;
        auVar61._4_4_ = auVar123._4_4_ * auVar123._4_4_;
        auVar61._0_4_ = auVar123._0_4_ * auVar123._0_4_;
        auVar61._8_4_ = auVar123._8_4_ * auVar123._8_4_;
        auVar61._12_4_ = auVar123._12_4_ * auVar123._12_4_;
        auVar61._16_4_ = auVar123._16_4_ * auVar123._16_4_;
        auVar61._20_4_ = auVar123._20_4_ * auVar123._20_4_;
        auVar61._24_4_ = auVar123._24_4_ * auVar123._24_4_;
        auVar61._28_4_ = auVar123._28_4_;
        auVar201 = vcmpps_avx(auVar61,auVar207,2);
        local_380 = (int)lVar105;
        auVar208._4_4_ = local_380;
        auVar208._0_4_ = local_380;
        auVar208._8_4_ = local_380;
        auVar208._12_4_ = local_380;
        auVar208._16_4_ = local_380;
        auVar208._20_4_ = local_380;
        auVar208._24_4_ = local_380;
        auVar208._28_4_ = local_380;
        auVar123 = vpor_avx2(auVar208,_DAT_01fb4ba0);
        auVar23 = vpcmpgtd_avx2(local_480,auVar123);
        auVar123 = auVar23 & auVar201;
        fVar153 = (float)local_740;
        fVar128 = local_740._4_4_;
        fVar129 = (float)uStack_738;
        fVar130 = uStack_738._4_4_;
        fVar131 = (float)uStack_730;
        fVar132 = uStack_730._4_4_;
        fVar133 = (float)uStack_728;
        uVar222 = uStack_728._4_4_;
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
          auVar152 = ZEXT3264(local_780);
          auVar218 = ZEXT3264(auVar135);
          auVar210 = ZEXT3264(auVar210._0_32_);
        }
        else {
          _local_4a0 = vandps_avx(auVar23,auVar201);
          auVar62._4_4_ = (float)local_7a0._4_4_ * fVar89;
          auVar62._0_4_ = (float)local_7a0._0_4_ * fVar88;
          auVar62._8_4_ = fStack_798 * fVar90;
          auVar62._12_4_ = fStack_794 * fVar91;
          auVar62._16_4_ = fStack_790 * fVar92;
          auVar62._20_4_ = fStack_78c * fVar93;
          auVar62._24_4_ = fStack_788 * fVar94;
          auVar62._28_4_ = auVar201._28_4_;
          auVar174 = vfmadd213ps_fma(auVar209,local_760,auVar62);
          auVar174 = vfmadd213ps_fma(auVar124,local_800,ZEXT1632(auVar174));
          auVar174 = vfmadd132ps_fma(auVar141,ZEXT1632(auVar174),local_4c0);
          local_580 = ZEXT1632(auVar174);
          local_420._0_4_ = auVar97._0_4_;
          local_420._4_4_ = auVar97._4_4_;
          fStack_418 = auVar97._8_4_;
          fStack_414 = auVar97._12_4_;
          fStack_410 = auVar97._16_4_;
          fStack_40c = auVar97._20_4_;
          fStack_408 = auVar97._24_4_;
          auVar63._4_4_ = (float)local_7a0._4_4_ * (float)local_420._4_4_;
          auVar63._0_4_ = (float)local_7a0._0_4_ * (float)local_420._0_4_;
          auVar63._8_4_ = fStack_798 * fStack_418;
          auVar63._12_4_ = fStack_794 * fStack_414;
          auVar63._16_4_ = fStack_790 * fStack_410;
          auVar63._20_4_ = fStack_78c * fStack_40c;
          auVar63._24_4_ = fStack_788 * fStack_408;
          auVar63._28_4_ = auVar201._28_4_;
          auVar174 = vfmadd213ps_fma(auVar121,local_760,auVar63);
          auVar174 = vfmadd213ps_fma(auVar125,local_800,ZEXT1632(auVar174));
          auVar125 = *(undefined1 (*) [32])(lVar104 + 0x2200d38 + lVar105 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar104 + 0x22011bc + lVar105 * 4);
          auVar141 = *(undefined1 (*) [32])(lVar104 + 0x2201640 + lVar105 * 4);
          pfVar3 = (float *)(lVar104 + 0x2201ac4 + lVar105 * 4);
          fVar134 = *pfVar3;
          fVar203 = pfVar3[1];
          fVar204 = pfVar3[2];
          fVar205 = pfVar3[3];
          fVar219 = pfVar3[4];
          fVar220 = pfVar3[5];
          fVar221 = pfVar3[6];
          auVar64._4_4_ = fVar211 * fVar203;
          auVar64._0_4_ = fVar206 * fVar134;
          auVar64._8_4_ = fVar212 * fVar204;
          auVar64._12_4_ = fVar213 * fVar205;
          auVar64._16_4_ = fVar214 * fVar219;
          auVar64._20_4_ = fVar215 * fVar220;
          auVar64._24_4_ = fVar216 * fVar221;
          auVar64._28_4_ = uStack_784;
          auVar226._0_4_ = fVar134 * (float)local_740;
          auVar226._4_4_ = fVar203 * local_740._4_4_;
          auVar226._8_4_ = fVar204 * (float)uStack_738;
          auVar226._12_4_ = fVar205 * uStack_738._4_4_;
          auVar226._16_4_ = fVar219 * (float)uStack_730;
          auVar226._20_4_ = fVar220 * uStack_730._4_4_;
          auVar226._24_4_ = fVar221 * (float)uStack_728;
          auVar226._28_4_ = 0;
          auVar65._4_4_ = fVar203 * (float)local_7a0._4_4_;
          auVar65._0_4_ = fVar134 * (float)local_7a0._0_4_;
          auVar65._8_4_ = fVar204 * fStack_798;
          auVar65._12_4_ = fVar205 * fStack_794;
          auVar65._16_4_ = fVar219 * fStack_790;
          auVar65._20_4_ = fVar220 * fStack_78c;
          auVar65._24_4_ = fVar221 * fStack_788;
          auVar65._28_4_ = pfVar3[7];
          auVar179 = vfmadd231ps_fma(auVar64,auVar141,local_700);
          auVar9 = vfmadd231ps_fma(auVar226,auVar141,auVar135);
          auVar10 = vfmadd231ps_fma(auVar65,local_760,auVar141);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar121,auVar186);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,local_5e0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_800,auVar121);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar125,auVar168);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar125,local_640);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar125,local_4c0);
          pfVar3 = (float *)(lVar104 + 0x2203ee4 + lVar105 * 4);
          fVar134 = *pfVar3;
          fVar203 = pfVar3[1];
          fVar204 = pfVar3[2];
          fVar205 = pfVar3[3];
          fVar219 = pfVar3[4];
          fVar220 = pfVar3[5];
          fVar221 = pfVar3[6];
          auVar66._4_4_ = fVar211 * fVar203;
          auVar66._0_4_ = fVar206 * fVar134;
          auVar66._8_4_ = fVar212 * fVar204;
          auVar66._12_4_ = fVar213 * fVar205;
          auVar66._16_4_ = fVar214 * fVar219;
          auVar66._20_4_ = fVar215 * fVar220;
          auVar66._24_4_ = fVar216 * fVar221;
          auVar66._28_4_ = auVar218._28_4_;
          auVar67._4_4_ = local_740._4_4_ * fVar203;
          auVar67._0_4_ = (float)local_740 * fVar134;
          auVar67._8_4_ = (float)uStack_738 * fVar204;
          auVar67._12_4_ = uStack_738._4_4_ * fVar205;
          auVar67._16_4_ = (float)uStack_730 * fVar219;
          auVar67._20_4_ = uStack_730._4_4_ * fVar220;
          auVar67._24_4_ = (float)uStack_728 * fVar221;
          auVar67._28_4_ = local_460._28_4_;
          auVar68._4_4_ = (float)local_7a0._4_4_ * fVar203;
          auVar68._0_4_ = (float)local_7a0._0_4_ * fVar134;
          auVar68._8_4_ = fStack_798 * fVar204;
          auVar68._12_4_ = fStack_794 * fVar205;
          auVar68._16_4_ = fStack_790 * fVar219;
          auVar68._20_4_ = fStack_78c * fVar220;
          auVar68._24_4_ = fStack_788 * fVar221;
          auVar68._28_4_ = pfVar3[7];
          auVar125 = *(undefined1 (*) [32])(lVar104 + 0x2203a60 + lVar105 * 4);
          auVar11 = vfmadd231ps_fma(auVar66,auVar125,local_700);
          auVar109 = vfmadd231ps_fma(auVar67,auVar125,auVar135);
          auVar184 = vfmadd231ps_fma(auVar68,auVar125,local_760);
          auVar125 = *(undefined1 (*) [32])(lVar104 + 0x22035dc + lVar105 * 4);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar186);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar125,local_5e0);
          auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar125,local_800);
          auVar125 = *(undefined1 (*) [32])(lVar104 + 0x2203158 + lVar105 * 4);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar168);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar125,local_640);
          auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),local_4c0,auVar125);
          auVar125 = vandps_avx(ZEXT1632(auVar179),local_280);
          auVar121 = vandps_avx(ZEXT1632(auVar9),local_280);
          auVar121 = vmaxps_avx(auVar125,auVar121);
          auVar125 = vandps_avx(ZEXT1632(auVar10),local_280);
          auVar125 = vmaxps_avx(auVar121,auVar125);
          auVar125 = vcmpps_avx(auVar125,_local_4e0,1);
          auVar141 = vblendvps_avx(ZEXT1632(auVar179),local_440,auVar125);
          auVar124 = vblendvps_avx(ZEXT1632(auVar9),local_460,auVar125);
          auVar125 = vandps_avx(ZEXT1632(auVar11),local_280);
          auVar121 = vandps_avx(ZEXT1632(auVar109),local_280);
          auVar121 = vmaxps_avx(auVar125,auVar121);
          auVar125 = vandps_avx(local_280,ZEXT1632(auVar184));
          auVar125 = vmaxps_avx(auVar121,auVar125);
          auVar121 = vcmpps_avx(auVar125,_local_4e0,1);
          auVar125 = vblendvps_avx(ZEXT1632(auVar11),local_440,auVar121);
          auVar121 = vblendvps_avx(ZEXT1632(auVar109),local_460,auVar121);
          auVar174 = vfmadd213ps_fma(auVar113,local_4c0,ZEXT1632(auVar174));
          auVar179 = vfmadd213ps_fma(auVar141,auVar141,ZEXT832(0) << 0x20);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar124,auVar124);
          auVar113 = vrsqrtps_avx(ZEXT1632(auVar179));
          fVar134 = auVar113._0_4_;
          fVar203 = auVar113._4_4_;
          fVar204 = auVar113._8_4_;
          fVar205 = auVar113._12_4_;
          fVar219 = auVar113._16_4_;
          fVar220 = auVar113._20_4_;
          fVar221 = auVar113._24_4_;
          auVar69._4_4_ = fVar203 * fVar203 * fVar203 * auVar179._4_4_ * -0.5;
          auVar69._0_4_ = fVar134 * fVar134 * fVar134 * auVar179._0_4_ * -0.5;
          auVar69._8_4_ = fVar204 * fVar204 * fVar204 * auVar179._8_4_ * -0.5;
          auVar69._12_4_ = fVar205 * fVar205 * fVar205 * auVar179._12_4_ * -0.5;
          auVar69._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
          auVar69._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
          auVar69._24_4_ = fVar221 * fVar221 * fVar221 * -0.0;
          auVar69._28_4_ = 0;
          auVar165._8_4_ = 0x3fc00000;
          auVar165._0_8_ = 0x3fc000003fc00000;
          auVar165._12_4_ = 0x3fc00000;
          auVar165._16_4_ = 0x3fc00000;
          auVar165._20_4_ = 0x3fc00000;
          auVar165._24_4_ = 0x3fc00000;
          auVar165._28_4_ = 0x3fc00000;
          auVar179 = vfmadd231ps_fma(auVar69,auVar165,auVar113);
          fVar134 = auVar179._0_4_;
          fVar203 = auVar179._4_4_;
          auVar70._4_4_ = auVar124._4_4_ * fVar203;
          auVar70._0_4_ = auVar124._0_4_ * fVar134;
          fVar204 = auVar179._8_4_;
          auVar70._8_4_ = auVar124._8_4_ * fVar204;
          fVar205 = auVar179._12_4_;
          auVar70._12_4_ = auVar124._12_4_ * fVar205;
          auVar70._16_4_ = auVar124._16_4_ * 0.0;
          auVar70._20_4_ = auVar124._20_4_ * 0.0;
          auVar70._24_4_ = auVar124._24_4_ * 0.0;
          auVar70._28_4_ = auVar124._28_4_;
          auVar71._4_4_ = fVar203 * -auVar141._4_4_;
          auVar71._0_4_ = fVar134 * -auVar141._0_4_;
          auVar71._8_4_ = fVar204 * -auVar141._8_4_;
          auVar71._12_4_ = fVar205 * -auVar141._12_4_;
          auVar71._16_4_ = -auVar141._16_4_ * 0.0;
          auVar71._20_4_ = -auVar141._20_4_ * 0.0;
          auVar71._24_4_ = -auVar141._24_4_ * 0.0;
          auVar71._28_4_ = auVar113._28_4_;
          auVar179 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar121,auVar121);
          auVar113 = vrsqrtps_avx(ZEXT1632(auVar179));
          auVar72._28_4_ = local_460._28_4_;
          auVar72._0_28_ =
               ZEXT1628(CONCAT412(fVar205 * 0.0,
                                  CONCAT48(fVar204 * 0.0,CONCAT44(fVar203 * 0.0,fVar134 * 0.0))));
          fVar134 = auVar113._0_4_;
          fVar203 = auVar113._4_4_;
          fVar204 = auVar113._8_4_;
          fVar205 = auVar113._12_4_;
          fVar219 = auVar113._16_4_;
          fVar220 = auVar113._20_4_;
          fVar221 = auVar113._24_4_;
          auVar73._4_4_ = fVar203 * fVar203 * fVar203 * auVar179._4_4_ * -0.5;
          auVar73._0_4_ = fVar134 * fVar134 * fVar134 * auVar179._0_4_ * -0.5;
          auVar73._8_4_ = fVar204 * fVar204 * fVar204 * auVar179._8_4_ * -0.5;
          auVar73._12_4_ = fVar205 * fVar205 * fVar205 * auVar179._12_4_ * -0.5;
          auVar73._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
          auVar73._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
          auVar73._24_4_ = fVar221 * fVar221 * fVar221 * -0.0;
          auVar73._28_4_ = 0;
          auVar179 = vfmadd231ps_fma(auVar73,auVar165,auVar113);
          fVar134 = auVar179._0_4_;
          fVar203 = auVar179._4_4_;
          auVar74._4_4_ = auVar121._4_4_ * fVar203;
          auVar74._0_4_ = auVar121._0_4_ * fVar134;
          fVar204 = auVar179._8_4_;
          auVar74._8_4_ = auVar121._8_4_ * fVar204;
          fVar205 = auVar179._12_4_;
          auVar74._12_4_ = auVar121._12_4_ * fVar205;
          auVar74._16_4_ = auVar121._16_4_ * 0.0;
          auVar74._20_4_ = auVar121._20_4_ * 0.0;
          auVar74._24_4_ = auVar121._24_4_ * 0.0;
          auVar74._28_4_ = 0;
          auVar75._4_4_ = fVar203 * -auVar125._4_4_;
          auVar75._0_4_ = fVar134 * -auVar125._0_4_;
          auVar75._8_4_ = fVar204 * -auVar125._8_4_;
          auVar75._12_4_ = fVar205 * -auVar125._12_4_;
          auVar75._16_4_ = -auVar125._16_4_ * 0.0;
          auVar75._20_4_ = -auVar125._20_4_ * 0.0;
          auVar75._24_4_ = -auVar125._24_4_ * 0.0;
          auVar75._28_4_ = 0;
          auVar76._28_4_ = 0xbf000000;
          auVar76._0_28_ =
               ZEXT1628(CONCAT412(fVar205 * 0.0,
                                  CONCAT48(fVar204 * 0.0,CONCAT44(fVar203 * 0.0,fVar134 * 0.0))));
          auVar179 = vfmadd213ps_fma(auVar70,local_560,local_400);
          auVar9 = vfmadd213ps_fma(auVar71,local_560,local_720);
          auVar10 = vfmadd213ps_fma(auVar72,local_560,ZEXT1632(auVar174));
          auVar190 = vfnmadd213ps_fma(auVar70,local_560,local_400);
          auVar11 = vfmadd213ps_fma(auVar74,auVar162,auVar193);
          auVar191 = vfnmadd213ps_fma(auVar71,local_560,local_720);
          auVar109 = vfmadd213ps_fma(auVar75,auVar162,auVar144);
          auVar174 = vfnmadd231ps_fma(ZEXT1632(auVar174),local_560,auVar72);
          auVar184 = vfmadd213ps_fma(auVar76,auVar162,local_580);
          auVar195 = vfnmadd213ps_fma(auVar74,auVar162,auVar193);
          auVar110 = vfnmadd213ps_fma(auVar75,auVar162,auVar144);
          auVar196 = vfnmadd231ps_fma(local_580,auVar162,auVar76);
          auVar113 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar191));
          auVar125 = vsubps_avx(ZEXT1632(auVar184),ZEXT1632(auVar174));
          auVar77._4_4_ = auVar113._4_4_ * auVar174._4_4_;
          auVar77._0_4_ = auVar113._0_4_ * auVar174._0_4_;
          auVar77._8_4_ = auVar113._8_4_ * auVar174._8_4_;
          auVar77._12_4_ = auVar113._12_4_ * auVar174._12_4_;
          auVar77._16_4_ = auVar113._16_4_ * 0.0;
          auVar77._20_4_ = auVar113._20_4_ * 0.0;
          auVar77._24_4_ = auVar113._24_4_ * 0.0;
          auVar77._28_4_ = 0;
          auVar167 = vfmsub231ps_fma(auVar77,ZEXT1632(auVar191),auVar125);
          auVar78._4_4_ = auVar190._4_4_ * auVar125._4_4_;
          auVar78._0_4_ = auVar190._0_4_ * auVar125._0_4_;
          auVar78._8_4_ = auVar190._8_4_ * auVar125._8_4_;
          auVar78._12_4_ = auVar190._12_4_ * auVar125._12_4_;
          auVar78._16_4_ = auVar125._16_4_ * 0.0;
          auVar78._20_4_ = auVar125._20_4_ * 0.0;
          auVar78._24_4_ = auVar125._24_4_ * 0.0;
          auVar78._28_4_ = auVar125._28_4_;
          auVar209 = ZEXT1632(auVar190);
          auVar125 = vsubps_avx(ZEXT1632(auVar11),auVar209);
          auVar123 = ZEXT1632(auVar174);
          auVar174 = vfmsub231ps_fma(auVar78,auVar123,auVar125);
          auVar79._4_4_ = auVar191._4_4_ * auVar125._4_4_;
          auVar79._0_4_ = auVar191._0_4_ * auVar125._0_4_;
          auVar79._8_4_ = auVar191._8_4_ * auVar125._8_4_;
          auVar79._12_4_ = auVar191._12_4_ * auVar125._12_4_;
          auVar79._16_4_ = auVar125._16_4_ * 0.0;
          auVar79._20_4_ = auVar125._20_4_ * 0.0;
          auVar79._24_4_ = auVar125._24_4_ * 0.0;
          auVar79._28_4_ = auVar125._28_4_;
          auVar190 = vfmsub231ps_fma(auVar79,auVar209,auVar113);
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar190),ZEXT832(0) << 0x20,ZEXT1632(auVar174));
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),ZEXT832(0) << 0x20,ZEXT1632(auVar167));
          auVar23 = vcmpps_avx(ZEXT1632(auVar174),ZEXT832(0) << 0x20,2);
          auVar113 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar179),auVar23);
          auVar125 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar9),auVar23);
          local_7e0 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar10),auVar23);
          auVar121 = vblendvps_avx(auVar209,ZEXT1632(auVar11),auVar23);
          auVar141 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar109),auVar23);
          auVar124 = vblendvps_avx(auVar123,ZEXT1632(auVar184),auVar23);
          auVar209 = vblendvps_avx(ZEXT1632(auVar11),auVar209,auVar23);
          auVar201 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar191),auVar23);
          auVar174 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
          auVar123 = vblendvps_avx(ZEXT1632(auVar184),auVar123,auVar23);
          auVar209 = vsubps_avx(auVar209,auVar113);
          auVar201 = vsubps_avx(auVar201,auVar125);
          auVar144 = vsubps_avx(auVar123,local_7e0);
          auVar228 = ZEXT3264(auVar144);
          auVar193 = vsubps_avx(auVar113,auVar121);
          auVar135 = vsubps_avx(auVar125,auVar141);
          auVar185 = vsubps_avx(local_7e0,auVar124);
          auVar234 = ZEXT3264(auVar185);
          auVar187._0_4_ = auVar144._0_4_ * auVar113._0_4_;
          auVar187._4_4_ = auVar144._4_4_ * auVar113._4_4_;
          auVar187._8_4_ = auVar144._8_4_ * auVar113._8_4_;
          auVar187._12_4_ = auVar144._12_4_ * auVar113._12_4_;
          auVar187._16_4_ = auVar144._16_4_ * auVar113._16_4_;
          auVar187._20_4_ = auVar144._20_4_ * auVar113._20_4_;
          auVar187._24_4_ = auVar144._24_4_ * auVar113._24_4_;
          auVar187._28_4_ = 0;
          auVar179 = vfmsub231ps_fma(auVar187,local_7e0,auVar209);
          auVar80._4_4_ = auVar209._4_4_ * auVar125._4_4_;
          auVar80._0_4_ = auVar209._0_4_ * auVar125._0_4_;
          auVar80._8_4_ = auVar209._8_4_ * auVar125._8_4_;
          auVar80._12_4_ = auVar209._12_4_ * auVar125._12_4_;
          auVar80._16_4_ = auVar209._16_4_ * auVar125._16_4_;
          auVar80._20_4_ = auVar209._20_4_ * auVar125._20_4_;
          auVar80._24_4_ = auVar209._24_4_ * auVar125._24_4_;
          auVar80._28_4_ = auVar123._28_4_;
          auVar9 = vfmsub231ps_fma(auVar80,auVar113,auVar201);
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
          auVar188._0_4_ = auVar201._0_4_ * local_7e0._0_4_;
          auVar188._4_4_ = auVar201._4_4_ * local_7e0._4_4_;
          auVar188._8_4_ = auVar201._8_4_ * local_7e0._8_4_;
          auVar188._12_4_ = auVar201._12_4_ * local_7e0._12_4_;
          auVar188._16_4_ = auVar201._16_4_ * local_7e0._16_4_;
          auVar188._20_4_ = auVar201._20_4_ * local_7e0._20_4_;
          auVar188._24_4_ = auVar201._24_4_ * local_7e0._24_4_;
          auVar188._28_4_ = 0;
          auVar9 = vfmsub231ps_fma(auVar188,auVar125,auVar144);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
          auVar189._0_4_ = auVar185._0_4_ * auVar121._0_4_;
          auVar189._4_4_ = auVar185._4_4_ * auVar121._4_4_;
          auVar189._8_4_ = auVar185._8_4_ * auVar121._8_4_;
          auVar189._12_4_ = auVar185._12_4_ * auVar121._12_4_;
          auVar189._16_4_ = auVar185._16_4_ * auVar121._16_4_;
          auVar189._20_4_ = auVar185._20_4_ * auVar121._20_4_;
          auVar189._24_4_ = auVar185._24_4_ * auVar121._24_4_;
          auVar189._28_4_ = 0;
          auVar179 = vfmsub231ps_fma(auVar189,auVar193,auVar124);
          auVar81._4_4_ = auVar135._4_4_ * auVar124._4_4_;
          auVar81._0_4_ = auVar135._0_4_ * auVar124._0_4_;
          auVar81._8_4_ = auVar135._8_4_ * auVar124._8_4_;
          auVar81._12_4_ = auVar135._12_4_ * auVar124._12_4_;
          auVar81._16_4_ = auVar135._16_4_ * auVar124._16_4_;
          auVar81._20_4_ = auVar135._20_4_ * auVar124._20_4_;
          auVar81._24_4_ = auVar135._24_4_ * auVar124._24_4_;
          auVar81._28_4_ = auVar113._28_4_;
          auVar10 = vfmsub231ps_fma(auVar81,auVar141,auVar185);
          auVar82._4_4_ = auVar193._4_4_ * auVar141._4_4_;
          auVar82._0_4_ = auVar193._0_4_ * auVar141._0_4_;
          auVar82._8_4_ = auVar193._8_4_ * auVar141._8_4_;
          auVar82._12_4_ = auVar193._12_4_ * auVar141._12_4_;
          auVar82._16_4_ = auVar193._16_4_ * auVar141._16_4_;
          auVar82._20_4_ = auVar193._20_4_ * auVar141._20_4_;
          auVar82._24_4_ = auVar193._24_4_ * auVar141._24_4_;
          auVar82._28_4_ = auVar141._28_4_;
          auVar11 = vfmsub231ps_fma(auVar82,auVar135,auVar121);
          auVar124 = ZEXT832(0) << 0x20;
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar124,ZEXT1632(auVar179));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar124,ZEXT1632(auVar10));
          auVar121 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
          auVar121 = vcmpps_avx(auVar121,auVar124,2);
          auVar179 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
          auVar174 = vpand_avx(auVar179,auVar174);
          auVar121 = vpmovsxwd_avx2(auVar174);
          auVar141 = local_7e0;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar121[0x1f]) {
LAB_013002cf:
            auVar202 = auVar141;
            auVar170._8_8_ = local_6c0[1]._8_8_;
            auVar170._0_8_ = local_6c0[1]._0_8_;
            auVar170._16_8_ = local_6c0[1]._16_8_;
            auVar170._24_8_ = local_6c0[1]._24_8_;
          }
          else {
            auVar83._4_4_ = auVar201._4_4_ * auVar185._4_4_;
            auVar83._0_4_ = auVar201._0_4_ * auVar185._0_4_;
            auVar83._8_4_ = auVar201._8_4_ * auVar185._8_4_;
            auVar83._12_4_ = auVar201._12_4_ * auVar185._12_4_;
            auVar83._16_4_ = auVar201._16_4_ * auVar185._16_4_;
            auVar83._20_4_ = auVar201._20_4_ * auVar185._20_4_;
            auVar83._24_4_ = auVar201._24_4_ * auVar185._24_4_;
            auVar83._28_4_ = auVar121._28_4_;
            auVar184 = vfmsub231ps_fma(auVar83,auVar135,auVar144);
            auVar194._0_4_ = auVar144._0_4_ * auVar193._0_4_;
            auVar194._4_4_ = auVar144._4_4_ * auVar193._4_4_;
            auVar194._8_4_ = auVar144._8_4_ * auVar193._8_4_;
            auVar194._12_4_ = auVar144._12_4_ * auVar193._12_4_;
            auVar194._16_4_ = auVar144._16_4_ * auVar193._16_4_;
            auVar194._20_4_ = auVar144._20_4_ * auVar193._20_4_;
            auVar194._24_4_ = auVar144._24_4_ * auVar193._24_4_;
            auVar194._28_4_ = 0;
            auVar167 = vfmsub231ps_fma(auVar194,auVar209,auVar185);
            auVar84._4_4_ = auVar209._4_4_ * auVar135._4_4_;
            auVar84._0_4_ = auVar209._0_4_ * auVar135._0_4_;
            auVar84._8_4_ = auVar209._8_4_ * auVar135._8_4_;
            auVar84._12_4_ = auVar209._12_4_ * auVar135._12_4_;
            auVar84._16_4_ = auVar209._16_4_ * auVar135._16_4_;
            auVar84._20_4_ = auVar209._20_4_ * auVar135._20_4_;
            auVar84._24_4_ = auVar209._24_4_ * auVar135._24_4_;
            auVar84._28_4_ = auVar135._28_4_;
            auVar190 = vfmsub231ps_fma(auVar84,auVar193,auVar201);
            auVar179 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar167),ZEXT1632(auVar190));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT1632(auVar184),auVar124);
            auVar121 = vrcpps_avx(ZEXT1632(auVar109));
            auVar227._8_4_ = 0x3f800000;
            auVar227._0_8_ = 0x3f8000003f800000;
            auVar227._12_4_ = 0x3f800000;
            auVar227._16_4_ = 0x3f800000;
            auVar227._20_4_ = 0x3f800000;
            auVar227._24_4_ = 0x3f800000;
            auVar227._28_4_ = 0x3f800000;
            auVar228 = ZEXT3264(auVar227);
            auVar179 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar109),auVar227);
            auVar11 = vfmadd132ps_fma(ZEXT1632(auVar179),auVar121,auVar121);
            auVar202 = ZEXT1632(auVar11);
            auVar85._4_4_ = auVar190._4_4_ * local_7e0._4_4_;
            auVar85._0_4_ = auVar190._0_4_ * local_7e0._0_4_;
            auVar85._8_4_ = auVar190._8_4_ * local_7e0._8_4_;
            auVar85._12_4_ = auVar190._12_4_ * local_7e0._12_4_;
            auVar85._16_4_ = local_7e0._16_4_ * 0.0;
            auVar85._20_4_ = local_7e0._20_4_ * 0.0;
            auVar85._24_4_ = local_7e0._24_4_ * 0.0;
            auVar85._28_4_ = auVar125._28_4_;
            auVar179 = vfmadd231ps_fma(auVar85,ZEXT1632(auVar167),auVar125);
            auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT1632(auVar184),auVar113);
            fVar134 = auVar11._0_4_;
            fVar203 = auVar11._4_4_;
            fVar204 = auVar11._8_4_;
            fVar205 = auVar11._12_4_;
            auVar121 = ZEXT1632(CONCAT412(fVar205 * auVar179._12_4_,
                                          CONCAT48(fVar204 * auVar179._8_4_,
                                                   CONCAT44(fVar203 * auVar179._4_4_,
                                                            fVar134 * auVar179._0_4_))));
            uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar169._4_4_ = uVar106;
            auVar169._0_4_ = uVar106;
            auVar169._8_4_ = uVar106;
            auVar169._12_4_ = uVar106;
            auVar169._16_4_ = uVar106;
            auVar169._20_4_ = uVar106;
            auVar169._24_4_ = uVar106;
            auVar169._28_4_ = uVar106;
            auVar96._4_4_ = uStack_67c;
            auVar96._0_4_ = local_680;
            auVar96._8_4_ = uStack_678;
            auVar96._12_4_ = uStack_674;
            auVar96._16_4_ = uStack_670;
            auVar96._20_4_ = uStack_66c;
            auVar96._24_4_ = uStack_668;
            auVar96._28_4_ = uStack_664;
            auVar113 = vcmpps_avx(auVar96,auVar121,2);
            auVar125 = vcmpps_avx(auVar121,auVar169,2);
            auVar113 = vandps_avx(auVar125,auVar113);
            auVar179 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar174 = vpand_avx(auVar174,auVar179);
            auVar113 = vpmovsxwd_avx2(auVar174);
            auVar141 = ZEXT1632(auVar11);
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar113 >> 0x7f,0) == '\0') &&
                  (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0xbf,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar113[0x1f]) goto LAB_013002cf;
            auVar113 = vcmpps_avx(ZEXT1632(auVar109),ZEXT832(0) << 0x20,4);
            auVar179 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar174 = vpand_avx(auVar174,auVar179);
            auVar113 = vpmovsxwd_avx2(auVar174);
            auVar170._8_8_ = local_6c0[1]._8_8_;
            auVar170._0_8_ = local_6c0[1]._0_8_;
            auVar170._16_8_ = local_6c0[1]._16_8_;
            auVar170._24_8_ = local_6c0[1]._24_8_;
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar113 >> 0x7f,0) != '\0') ||
                  (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0xbf,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar113[0x1f] < '\0') {
              auVar141 = ZEXT1632(CONCAT412(fVar205 * auVar9._12_4_,
                                            CONCAT48(fVar204 * auVar9._8_4_,
                                                     CONCAT44(fVar203 * auVar9._4_4_,
                                                              fVar134 * auVar9._0_4_))));
              auVar86._28_4_ = SUB84(local_6c0[1]._24_8_,4);
              auVar86._0_28_ =
                   ZEXT1628(CONCAT412(fVar205 * auVar10._12_4_,
                                      CONCAT48(fVar204 * auVar10._8_4_,
                                               CONCAT44(fVar203 * auVar10._4_4_,
                                                        fVar134 * auVar10._0_4_))));
              auVar202._8_4_ = 0x3f800000;
              auVar202._0_8_ = 0x3f8000003f800000;
              auVar202._12_4_ = 0x3f800000;
              auVar202._16_4_ = 0x3f800000;
              auVar202._20_4_ = 0x3f800000;
              auVar202._24_4_ = 0x3f800000;
              auVar202._28_4_ = 0x3f800000;
              auVar125 = vsubps_avx(auVar202,auVar141);
              local_780 = vblendvps_avx(auVar125,auVar141,auVar23);
              auVar125 = vsubps_avx(auVar202,auVar86);
              local_520 = vblendvps_avx(auVar125,auVar86,auVar23);
              auVar170 = auVar113;
              local_620 = auVar121;
            }
          }
          auVar218 = ZEXT3264(local_660);
          auVar210 = ZEXT3264(CONCAT428(fStack_524,
                                        CONCAT424(fStack_528,
                                                  CONCAT420(fStack_52c,
                                                            CONCAT416(fStack_530,
                                                                      CONCAT412(fStack_534,
                                                                                CONCAT48(fStack_538,
                                                                                         CONCAT44(
                                                  fStack_53c,local_540))))))));
          if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar170 >> 0x7f,0) != '\0') ||
                (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar170 >> 0xbf,0) != '\0') ||
              (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar170[0x1f] < '\0') {
            auVar113 = vsubps_avx(auVar162,local_560);
            auVar174 = vfmadd213ps_fma(auVar113,local_780,local_560);
            fVar134 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar87._4_4_ = (auVar174._4_4_ + auVar174._4_4_) * fVar134;
            auVar87._0_4_ = (auVar174._0_4_ + auVar174._0_4_) * fVar134;
            auVar87._8_4_ = (auVar174._8_4_ + auVar174._8_4_) * fVar134;
            auVar87._12_4_ = (auVar174._12_4_ + auVar174._12_4_) * fVar134;
            auVar87._16_4_ = fVar134 * 0.0;
            auVar87._20_4_ = fVar134 * 0.0;
            auVar87._24_4_ = fVar134 * 0.0;
            auVar87._28_4_ = fVar134;
            auVar113 = vcmpps_avx(local_620,auVar87,6);
            auVar125 = auVar170 & auVar113;
            if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar125 >> 0x7f,0) != '\0') ||
                  (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0xbf,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar125[0x1f] < '\0') {
              auVar146._8_4_ = 0xbf800000;
              auVar146._0_8_ = 0xbf800000bf800000;
              auVar146._12_4_ = 0xbf800000;
              auVar146._16_4_ = 0xbf800000;
              auVar146._20_4_ = 0xbf800000;
              auVar146._24_4_ = 0xbf800000;
              auVar146._28_4_ = 0xbf800000;
              auVar166._8_4_ = 0x40000000;
              auVar166._0_8_ = 0x4000000040000000;
              auVar166._12_4_ = 0x40000000;
              auVar166._16_4_ = 0x40000000;
              auVar166._20_4_ = 0x40000000;
              auVar166._24_4_ = 0x40000000;
              auVar166._28_4_ = 0x40000000;
              auVar174 = vfmadd213ps_fma(local_520,auVar166,auVar146);
              local_3e0 = local_780;
              local_3c0 = ZEXT1632(auVar174);
              local_3a0 = local_620;
              local_360 = local_890;
              uStack_358 = uStack_888;
              local_350 = local_8a0;
              uStack_348 = uStack_898;
              local_340 = local_8b0;
              uStack_338 = uStack_8a8;
              pGVar15 = (context->scene->geometries).items[uVar13].ptr;
              auVar152 = ZEXT3264(local_780);
              local_520 = local_3c0;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_6e0 = vandps_avx(auVar113,auVar170);
                fVar153 = (float)local_380;
                local_300[0] = (fVar153 + local_780._0_4_ + 0.0) * local_120;
                local_300[1] = (fVar153 + local_780._4_4_ + 1.0) * fStack_11c;
                local_300[2] = (fVar153 + local_780._8_4_ + 2.0) * fStack_118;
                local_300[3] = (fVar153 + local_780._12_4_ + 3.0) * fStack_114;
                fStack_2f0 = (fVar153 + local_780._16_4_ + 4.0) * fStack_110;
                fStack_2ec = (fVar153 + local_780._20_4_ + 5.0) * fStack_10c;
                fStack_2e8 = (fVar153 + local_780._24_4_ + 6.0) * fStack_108;
                fStack_2e4 = fVar153 + local_780._28_4_ + 7.0;
                local_520._0_8_ = auVar174._0_8_;
                local_520._8_8_ = auVar174._8_8_;
                local_2e0 = local_520._0_8_;
                uStack_2d8 = local_520._8_8_;
                uStack_2d0 = 0;
                uStack_2c8 = 0;
                local_2c0 = local_620;
                auVar147._8_4_ = 0x7f800000;
                auVar147._0_8_ = 0x7f8000007f800000;
                auVar147._12_4_ = 0x7f800000;
                auVar147._16_4_ = 0x7f800000;
                auVar147._20_4_ = 0x7f800000;
                auVar147._24_4_ = 0x7f800000;
                auVar147._28_4_ = 0x7f800000;
                auVar113 = vblendvps_avx(auVar147,local_620,local_6e0);
                auVar125 = vshufps_avx(auVar113,auVar113,0xb1);
                auVar125 = vminps_avx(auVar113,auVar125);
                auVar121 = vshufpd_avx(auVar125,auVar125,5);
                auVar125 = vminps_avx(auVar125,auVar121);
                auVar121 = vpermpd_avx2(auVar125,0x4e);
                auVar125 = vminps_avx(auVar125,auVar121);
                auVar125 = vcmpps_avx(auVar113,auVar125,0);
                auVar121 = local_6e0 & auVar125;
                auVar113 = local_6e0;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar121 >> 0x7f,0) != '\0') ||
                      (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar121 >> 0xbf,0) != '\0') ||
                    (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar121[0x1f] < '\0') {
                  auVar113 = vandps_avx(auVar125,local_6e0);
                }
                uVar100 = vmovmskps_avx(auVar113);
                uVar24 = 0;
                for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
                  uVar24 = uVar24 + 1;
                }
                uVar102 = (ulong)uVar24;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar153 = local_300[uVar102];
                  uVar106 = *(undefined4 *)((long)&local_2e0 + uVar102 * 4);
                  fVar128 = 1.0 - fVar153;
                  auVar174 = ZEXT416((uint)(fVar153 * fVar128 * 4.0));
                  auVar179 = vfnmsub213ss_fma(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),auVar174
                                             );
                  auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),auVar174)
                  ;
                  fVar128 = fVar128 * -fVar128 * 0.5;
                  fVar129 = auVar179._0_4_ * 0.5;
                  fVar130 = auVar174._0_4_ * 0.5;
                  fVar131 = fVar153 * fVar153 * 0.5;
                  auVar175._0_4_ = fVar131 * fVar19;
                  auVar175._4_4_ = fVar131 * fVar20;
                  auVar175._8_4_ = fVar131 * fVar21;
                  auVar175._12_4_ = fVar131 * fVar22;
                  auVar156._4_4_ = fVar130;
                  auVar156._0_4_ = fVar130;
                  auVar156._8_4_ = fVar130;
                  auVar156._12_4_ = fVar130;
                  auVar174 = vfmadd132ps_fma(auVar156,auVar175,auVar8);
                  auVar176._4_4_ = fVar129;
                  auVar176._0_4_ = fVar129;
                  auVar176._8_4_ = fVar129;
                  auVar176._12_4_ = fVar129;
                  auVar174 = vfmadd132ps_fma(auVar176,auVar174,auVar7);
                  auVar157._4_4_ = fVar128;
                  auVar157._0_4_ = fVar128;
                  auVar157._8_4_ = fVar128;
                  auVar157._12_4_ = fVar128;
                  auVar174 = vfmadd132ps_fma(auVar157,auVar174,auVar18);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar102 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar174._0_4_;
                  uVar222 = vextractps_avx(auVar174,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar222;
                  uVar222 = vextractps_avx(auVar174,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar222;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar153;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar106;
                  *(uint *)(ray + k * 4 + 0x220) = uVar99;
                  *(uint *)(ray + k * 4 + 0x240) = uVar13;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar152 = ZEXT864(0) << 0x20;
                  auVar113 = vpcmpeqd_avx2(auVar202,auVar202);
                  auVar171 = ZEXT3264(auVar113);
                  _local_420 = *pauVar2;
                  local_37c = iVar98;
                  local_370 = uVar183;
                  uStack_368 = uVar95;
                  while( true ) {
                    fVar153 = local_300[uVar102];
                    auVar111._4_4_ = fVar153;
                    auVar111._0_4_ = fVar153;
                    auVar111._8_4_ = fVar153;
                    auVar111._12_4_ = fVar153;
                    local_1e0._16_4_ = fVar153;
                    local_1e0._0_16_ = auVar111;
                    local_1e0._20_4_ = fVar153;
                    local_1e0._24_4_ = fVar153;
                    local_1e0._28_4_ = fVar153;
                    local_1c0 = *(undefined4 *)((long)&local_2e0 + uVar102 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar102 * 4);
                    fVar129 = 1.0 - fVar153;
                    auVar174 = ZEXT416((uint)(fVar153 * fVar129 * 4.0));
                    auVar179 = vfnmsub213ss_fma(auVar111,auVar111,auVar174);
                    auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),
                                               auVar174);
                    fVar128 = auVar174._0_4_ * 0.5;
                    fVar153 = fVar153 * fVar153 * 0.5;
                    auVar177._0_4_ = fVar153 * fVar19;
                    auVar177._4_4_ = fVar153 * fVar20;
                    auVar177._8_4_ = fVar153 * fVar21;
                    auVar177._12_4_ = fVar153 * fVar22;
                    auVar158._4_4_ = fVar128;
                    auVar158._0_4_ = fVar128;
                    auVar158._8_4_ = fVar128;
                    auVar158._12_4_ = fVar128;
                    auVar174 = vfmadd132ps_fma(auVar158,auVar177,auVar8);
                    fVar153 = auVar179._0_4_ * 0.5;
                    auVar178._4_4_ = fVar153;
                    auVar178._0_4_ = fVar153;
                    auVar178._8_4_ = fVar153;
                    auVar178._12_4_ = fVar153;
                    auVar174 = vfmadd132ps_fma(auVar178,auVar174,auVar7);
                    local_830.context = context->user;
                    fVar153 = fVar129 * -fVar129 * 0.5;
                    auVar159._4_4_ = fVar153;
                    auVar159._0_4_ = fVar153;
                    auVar159._8_4_ = fVar153;
                    auVar159._12_4_ = fVar153;
                    auVar179 = vfmadd132ps_fma(auVar159,auVar174,auVar6);
                    local_240 = auVar179._0_4_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    auVar174 = vmovshdup_avx(auVar179);
                    local_220 = auVar174._0_8_;
                    uStack_218 = local_220;
                    uStack_210 = local_220;
                    uStack_208 = local_220;
                    auVar174 = vshufps_avx(auVar179,auVar179,0xaa);
                    local_200 = auVar174._0_8_;
                    uStack_1f8 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1e8 = local_200;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_5c0._0_8_;
                    uStack_198 = local_5c0._8_8_;
                    uStack_190 = CONCAT44(uStack_5ac,uStack_5b0);
                    uStack_188 = CONCAT44(uStack_5a4,uStack_5a8);
                    local_180 = local_5a0._0_8_;
                    uStack_178 = local_5a0._8_8_;
                    uStack_170 = CONCAT44(uStack_58c,uStack_590);
                    uStack_168 = CONCAT44(uStack_584,uStack_588);
                    local_7a8[1] = auVar171._0_32_;
                    *local_7a8 = auVar171._0_32_;
                    local_160 = (local_830.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_830.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_6c0[0] = local_2a0;
                    local_830.valid = (int *)local_6c0;
                    local_830.geometryUserPtr = pGVar15->userPtr;
                    local_830.hit = (RTCHitN *)&local_240;
                    local_830.N = 8;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar113 = ZEXT1632(auVar171._0_16_);
                      auVar228 = ZEXT1664(auVar228._0_16_);
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      (*pGVar15->intersectionFilterN)(&local_830);
                      auVar113 = vpcmpeqd_avx2(auVar113,auVar113);
                      auVar171 = ZEXT3264(auVar113);
                      auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar125 = vpcmpeqd_avx2(local_6c0[0],auVar152._0_32_);
                    auVar113 = auVar171._0_32_ & ~auVar125;
                    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar113 >> 0x7f,0) == '\0') &&
                          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar113 >> 0xbf,0) == '\0') &&
                        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar113[0x1f]) {
                      auVar125 = auVar171._0_32_ ^ auVar125;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar113 = ZEXT1632(auVar171._0_16_);
                        auVar228 = ZEXT1664(auVar228._0_16_);
                        auVar234 = ZEXT1664(auVar234._0_16_);
                        (*p_Var16)(&local_830);
                        auVar113 = vpcmpeqd_avx2(auVar113,auVar113);
                        auVar171 = ZEXT3264(auVar113);
                        auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar121 = vpcmpeqd_avx2(local_6c0[0],auVar152._0_32_);
                      auVar125 = auVar171._0_32_ ^ auVar121;
                      auVar113 = auVar171._0_32_ & ~auVar121;
                      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar113 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar113 >> 0x7f,0) != '\0') ||
                            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar113 >> 0xbf,0) != '\0') ||
                          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar113[0x1f] < '\0') {
                        auVar148._0_4_ = auVar171._0_4_ ^ auVar121._0_4_;
                        auVar148._4_4_ = auVar171._4_4_ ^ auVar121._4_4_;
                        auVar148._8_4_ = auVar171._8_4_ ^ auVar121._8_4_;
                        auVar148._12_4_ = auVar171._12_4_ ^ auVar121._12_4_;
                        auVar148._16_4_ = auVar171._16_4_ ^ auVar121._16_4_;
                        auVar148._20_4_ = auVar171._20_4_ ^ auVar121._20_4_;
                        auVar148._24_4_ = auVar171._24_4_ ^ auVar121._24_4_;
                        auVar148._28_4_ = auVar171._28_4_ ^ auVar121._28_4_;
                        auVar113 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])local_830.hit);
                        *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x20));
                        *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x40));
                        *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x60));
                        *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x80));
                        *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar113;
                        auVar113 = vpmaskmovd_avx2(auVar148,*(undefined1 (*) [32])
                                                             (local_830.hit + 0xa0));
                        *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar113;
                        auVar113 = vpmaskmovd_avx2(auVar148,*(undefined1 (*) [32])
                                                             (local_830.hit + 0xc0));
                        *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar113;
                        auVar113 = vpmaskmovd_avx2(auVar148,*(undefined1 (*) [32])
                                                             (local_830.hit + 0xe0));
                        *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar113;
                        auVar113 = vpmaskmovd_avx2(auVar148,*(undefined1 (*) [32])
                                                             (local_830.hit + 0x100));
                        *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar113;
                      }
                    }
                    auVar113 = local_620;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar125 >> 0x7f,0) == '\0') &&
                          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar125 >> 0xbf,0) == '\0') &&
                        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar125[0x1f]) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar106;
                    }
                    else {
                      uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
                    }
                    *(undefined4 *)(local_6e0 + uVar102 * 4) = 0;
                    auVar126._4_4_ = uVar106;
                    auVar126._0_4_ = uVar106;
                    auVar126._8_4_ = uVar106;
                    auVar126._12_4_ = uVar106;
                    auVar126._16_4_ = uVar106;
                    auVar126._20_4_ = uVar106;
                    auVar126._24_4_ = uVar106;
                    auVar126._28_4_ = uVar106;
                    auVar121 = vcmpps_avx(auVar113,auVar126,2);
                    auVar125 = vandps_avx(auVar121,local_6e0);
                    local_6e0 = local_6e0 & auVar121;
                    if ((((((((local_6e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_6e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_6e0 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_6e0 >> 0x7f,0) == '\0') &&
                          (local_6e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_6e0 >> 0xbf,0) == '\0') &&
                        (local_6e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_6e0[0x1f]) break;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar113 = vblendvps_avx(auVar149,auVar113,auVar125);
                    auVar121 = vshufps_avx(auVar113,auVar113,0xb1);
                    auVar121 = vminps_avx(auVar113,auVar121);
                    auVar141 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar141);
                    auVar141 = vpermpd_avx2(auVar121,0x4e);
                    auVar121 = vminps_avx(auVar121,auVar141);
                    auVar121 = vcmpps_avx(auVar113,auVar121,0);
                    auVar141 = auVar125 & auVar121;
                    auVar113 = auVar125;
                    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar141 >> 0x7f,0) != '\0') ||
                          (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0xbf,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar141[0x1f] < '\0') {
                      auVar113 = vandps_avx(auVar121,auVar125);
                    }
                    uVar100 = vmovmskps_avx(auVar113);
                    uVar24 = 0;
                    for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
                      uVar24 = uVar24 + 1;
                    }
                    uVar102 = (ulong)uVar24;
                    local_6e0 = auVar125;
                  }
                  auVar218 = ZEXT3264(local_660);
                  auVar210 = ZEXT3264(CONCAT428(fStack_524,
                                                CONCAT424(fStack_528,
                                                          CONCAT420(fStack_52c,
                                                                    CONCAT416(fStack_530,
                                                                              CONCAT412(fStack_534,
                                                                                        CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
                }
                auVar152 = ZEXT3264(local_780);
                fVar153 = (float)local_740;
                fVar128 = local_740._4_4_;
                fVar129 = (float)uStack_738;
                fVar130 = uStack_738._4_4_;
                fVar131 = (float)uStack_730;
                fVar132 = uStack_730._4_4_;
                fVar133 = (float)uStack_728;
                uVar222 = uStack_728._4_4_;
              }
              goto LAB_012fffac;
            }
          }
          auVar152 = ZEXT3264(local_780);
        }
LAB_012fffac:
        auVar171 = ZEXT3264(local_700);
      }
    }
    uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar122._4_4_ = uVar106;
    auVar122._0_4_ = uVar106;
    auVar122._8_4_ = uVar106;
    auVar122._12_4_ = uVar106;
    auVar122._16_4_ = uVar106;
    auVar122._20_4_ = uVar106;
    auVar122._24_4_ = uVar106;
    auVar122._28_4_ = uVar106;
    auVar113 = vcmpps_avx(local_80,auVar122,2);
    uVar99 = vmovmskps_avx(auVar113);
    uVar107 = (ulong)((uint)uVar107 & uVar99);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }